

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

void embree::avx2::CurveNvIntersectorK<4,8>::
     intersect_t<embree::avx2::RibbonCurve1IntersectorK<embree::BezierCurveT,8,8>,embree::avx2::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  Primitive *pPVar1;
  undefined1 (*pauVar2) [28];
  float *pfVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [32];
  Primitive PVar8;
  undefined4 uVar9;
  RTCFilterFunctionN p_Var10;
  code *pcVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  long lVar20;
  ulong uVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  bool bVar72;
  bool bVar73;
  long lVar74;
  bool bVar75;
  bool bVar76;
  bool bVar77;
  bool bVar78;
  bool bVar79;
  bool bVar80;
  float fVar81;
  undefined8 uVar82;
  undefined8 uVar83;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [28];
  undefined1 auVar91 [32];
  undefined1 auVar92 [24];
  int iVar93;
  uint uVar94;
  ulong uVar95;
  uint uVar96;
  ulong uVar97;
  uint uVar98;
  long lVar99;
  Geometry *pGVar100;
  ulong uVar101;
  undefined4 uVar102;
  undefined8 uVar104;
  float fVar123;
  vint4 bi_2;
  undefined1 auVar105 [16];
  float fVar125;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  float fVar103;
  float fVar122;
  float fVar124;
  float fVar126;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar109 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float fVar130;
  undefined8 extraout_XMM1_Qa;
  vint4 bi_1;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  float fVar150;
  undefined1 auVar148 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar151;
  float fVar152;
  undefined1 auVar153 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar165 [32];
  float fVar170;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  float fVar171;
  float fVar183;
  vint4 ai_2;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  vint4 ai;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  vint4 bi;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [64];
  vint4 ai_1;
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  float fVar221;
  undefined1 auVar219 [32];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar215 [16];
  float fVar222;
  float fVar223;
  float fVar224;
  undefined1 auVar220 [64];
  undefined1 auVar225 [16];
  undefined1 auVar226 [64];
  undefined4 uVar227;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar234 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [16];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  float fVar243;
  float fVar244;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  float local_8e0;
  float fStack_8dc;
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float local_8c0;
  float fStack_8bc;
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  undefined1 local_8a0 [32];
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  RTCFilterFunctionNArguments local_7b0;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined1 local_760 [32];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  undefined8 uStack_6f8;
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [16];
  undefined1 (*local_6c8) [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  undefined1 auStack_610 [16];
  undefined1 local_600 [32];
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  float local_500;
  undefined1 auStack_4fc [8];
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  int local_460;
  int local_45c;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined1 local_400 [32];
  float local_3e0 [4];
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [32];
  undefined4 local_2a0;
  undefined4 uStack_29c;
  undefined4 uStack_298;
  undefined4 uStack_294;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [32];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  uint local_1c0;
  uint uStack_1bc;
  uint uStack_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  undefined4 local_180;
  undefined4 uStack_17c;
  undefined4 uStack_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar149 [64];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [64];
  undefined1 auVar214 [16];
  
  PVar8 = prim[1];
  uVar101 = (ulong)(byte)PVar8;
  lVar74 = uVar101 * 0x19;
  fVar152 = *(float *)(prim + lVar74 + 0x12);
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar12 = vsubps_avx(auVar12,*(undefined1 (*) [16])(prim + lVar74 + 6));
  auVar105._0_4_ = fVar152 * auVar12._0_4_;
  auVar105._4_4_ = fVar152 * auVar12._4_4_;
  auVar105._8_4_ = fVar152 * auVar12._8_4_;
  auVar105._12_4_ = fVar152 * auVar12._12_4_;
  auVar191._0_4_ = fVar152 * auVar13._0_4_;
  auVar191._4_4_ = fVar152 * auVar13._4_4_;
  auVar191._8_4_ = fVar152 * auVar13._8_4_;
  auVar191._12_4_ = fVar152 * auVar13._12_4_;
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar101 * 4 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar101 * 5 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar101 * 6 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar101 * 0xb + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar8 * 0xc + uVar101 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  uVar95 = (ulong)(uint)((int)(uVar101 * 9) * 2);
  auVar108 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 + 6)));
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar107 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 + uVar101 + 6)));
  auVar107 = vcvtdq2ps_avx(auVar107);
  uVar95 = (ulong)(uint)((int)(uVar101 * 5) << 2);
  auVar153 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 + 6)));
  auVar153 = vcvtdq2ps_avx(auVar153);
  auVar239._4_4_ = auVar191._0_4_;
  auVar239._0_4_ = auVar191._0_4_;
  auVar239._8_4_ = auVar191._0_4_;
  auVar239._12_4_ = auVar191._0_4_;
  auVar132 = vshufps_avx(auVar191,auVar191,0x55);
  auVar106 = vshufps_avx(auVar191,auVar191,0xaa);
  fVar152 = auVar106._0_4_;
  auVar228._0_4_ = fVar152 * auVar14._0_4_;
  fVar151 = auVar106._4_4_;
  auVar228._4_4_ = fVar151 * auVar14._4_4_;
  fVar123 = auVar106._8_4_;
  auVar228._8_4_ = fVar123 * auVar14._8_4_;
  fVar125 = auVar106._12_4_;
  auVar228._12_4_ = fVar125 * auVar14._12_4_;
  auVar225._0_4_ = auVar17._0_4_ * fVar152;
  auVar225._4_4_ = auVar17._4_4_ * fVar151;
  auVar225._8_4_ = auVar17._8_4_ * fVar123;
  auVar225._12_4_ = auVar17._12_4_ * fVar125;
  auVar211._0_4_ = auVar153._0_4_ * fVar152;
  auVar211._4_4_ = auVar153._4_4_ * fVar151;
  auVar211._8_4_ = auVar153._8_4_ * fVar123;
  auVar211._12_4_ = auVar153._12_4_ * fVar125;
  auVar106 = vfmadd231ps_fma(auVar228,auVar132,auVar13);
  auVar133 = vfmadd231ps_fma(auVar225,auVar132,auVar16);
  auVar132 = vfmadd231ps_fma(auVar211,auVar107,auVar132);
  auVar172 = vfmadd231ps_fma(auVar106,auVar239,auVar12);
  auVar133 = vfmadd231ps_fma(auVar133,auVar239,auVar15);
  auVar226 = ZEXT1664(auVar133);
  auVar185 = vfmadd231ps_fma(auVar132,auVar108,auVar239);
  auVar240._4_4_ = auVar105._0_4_;
  auVar240._0_4_ = auVar105._0_4_;
  auVar240._8_4_ = auVar105._0_4_;
  auVar240._12_4_ = auVar105._0_4_;
  auVar132 = vshufps_avx(auVar105,auVar105,0x55);
  auVar106 = vshufps_avx(auVar105,auVar105,0xaa);
  fVar152 = auVar106._0_4_;
  auVar192._0_4_ = fVar152 * auVar14._0_4_;
  fVar151 = auVar106._4_4_;
  auVar192._4_4_ = fVar151 * auVar14._4_4_;
  fVar123 = auVar106._8_4_;
  auVar192._8_4_ = fVar123 * auVar14._8_4_;
  fVar125 = auVar106._12_4_;
  auVar192._12_4_ = fVar125 * auVar14._12_4_;
  auVar131._0_4_ = auVar17._0_4_ * fVar152;
  auVar131._4_4_ = auVar17._4_4_ * fVar151;
  auVar131._8_4_ = auVar17._8_4_ * fVar123;
  auVar131._12_4_ = auVar17._12_4_ * fVar125;
  auVar106._0_4_ = auVar153._0_4_ * fVar152;
  auVar106._4_4_ = auVar153._4_4_ * fVar151;
  auVar106._8_4_ = auVar153._8_4_ * fVar123;
  auVar106._12_4_ = auVar153._12_4_ * fVar125;
  auVar13 = vfmadd231ps_fma(auVar192,auVar132,auVar13);
  auVar14 = vfmadd231ps_fma(auVar131,auVar132,auVar16);
  auVar16 = vfmadd231ps_fma(auVar106,auVar132,auVar107);
  auVar17 = vfmadd231ps_fma(auVar13,auVar240,auVar12);
  auVar107 = vfmadd231ps_fma(auVar14,auVar240,auVar15);
  auVar153 = vfmadd231ps_fma(auVar16,auVar240,auVar108);
  local_2d0._8_4_ = 0x7fffffff;
  local_2d0._0_8_ = 0x7fffffff7fffffff;
  local_2d0._12_4_ = 0x7fffffff;
  auVar12 = vandps_avx(auVar172,local_2d0);
  auVar184._8_4_ = 0x219392ef;
  auVar184._0_8_ = 0x219392ef219392ef;
  auVar184._12_4_ = 0x219392ef;
  auVar12 = vcmpps_avx(auVar12,auVar184,1);
  auVar13 = vblendvps_avx(auVar172,auVar184,auVar12);
  auVar12 = vandps_avx(auVar133,local_2d0);
  auVar12 = vcmpps_avx(auVar12,auVar184,1);
  auVar14 = vblendvps_avx(auVar133,auVar184,auVar12);
  auVar12 = vandps_avx(auVar185,local_2d0);
  auVar12 = vcmpps_avx(auVar12,auVar184,1);
  auVar12 = vblendvps_avx(auVar185,auVar184,auVar12);
  auVar15 = vrcpps_avx(auVar13);
  auVar207._8_4_ = 0x3f800000;
  auVar207._0_8_ = &DAT_3f8000003f800000;
  auVar207._12_4_ = 0x3f800000;
  auVar13 = vfnmadd213ps_fma(auVar13,auVar15,auVar207);
  auVar15 = vfmadd132ps_fma(auVar13,auVar15,auVar15);
  auVar13 = vrcpps_avx(auVar14);
  auVar14 = vfnmadd213ps_fma(auVar14,auVar13,auVar207);
  auVar16 = vfmadd132ps_fma(auVar14,auVar13,auVar13);
  auVar13 = vrcpps_avx(auVar12);
  auVar12 = vfnmadd213ps_fma(auVar12,auVar13,auVar207);
  auVar108 = vfmadd132ps_fma(auVar12,auVar13,auVar13);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar101 * 7 + 6);
  auVar12 = vpmovsxwd_avx(auVar12);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar17);
  auVar185._0_4_ = auVar15._0_4_ * auVar12._0_4_;
  auVar185._4_4_ = auVar15._4_4_ * auVar12._4_4_;
  auVar185._8_4_ = auVar15._8_4_ * auVar12._8_4_;
  auVar185._12_4_ = auVar15._12_4_ * auVar12._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar101 * 9 + 6);
  auVar12 = vpmovsxwd_avx(auVar13);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar17);
  auVar193._0_4_ = auVar15._0_4_ * auVar12._0_4_;
  auVar193._4_4_ = auVar15._4_4_ * auVar12._4_4_;
  auVar193._8_4_ = auVar15._8_4_ * auVar12._8_4_;
  auVar193._12_4_ = auVar15._12_4_ * auVar12._12_4_;
  auVar133._1_3_ = 0;
  auVar133[0] = PVar8;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar13 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar101 * -2 + 6);
  auVar12 = vpmovsxwd_avx(auVar15);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar107);
  auVar212._0_4_ = auVar12._0_4_ * auVar16._0_4_;
  auVar212._4_4_ = auVar12._4_4_ * auVar16._4_4_;
  auVar212._8_4_ = auVar12._8_4_ * auVar16._8_4_;
  auVar212._12_4_ = auVar12._12_4_ * auVar16._12_4_;
  auVar12 = vcvtdq2ps_avx(auVar13);
  auVar12 = vsubps_avx(auVar12,auVar107);
  auVar132._0_4_ = auVar16._0_4_ * auVar12._0_4_;
  auVar132._4_4_ = auVar16._4_4_ * auVar12._4_4_;
  auVar132._8_4_ = auVar16._8_4_ * auVar12._8_4_;
  auVar132._12_4_ = auVar16._12_4_ * auVar12._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar95 + uVar101 + 6);
  auVar12 = vpmovsxwd_avx(auVar16);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar153);
  auVar172._0_4_ = auVar108._0_4_ * auVar12._0_4_;
  auVar172._4_4_ = auVar108._4_4_ * auVar12._4_4_;
  auVar172._8_4_ = auVar108._8_4_ * auVar12._8_4_;
  auVar172._12_4_ = auVar108._12_4_ * auVar12._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar101 * 0x17 + 6);
  auVar12 = vpmovsxwd_avx(auVar17);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar153);
  auVar107._0_4_ = auVar108._0_4_ * auVar12._0_4_;
  auVar107._4_4_ = auVar108._4_4_ * auVar12._4_4_;
  auVar107._8_4_ = auVar108._8_4_ * auVar12._8_4_;
  auVar107._12_4_ = auVar108._12_4_ * auVar12._12_4_;
  auVar12 = vpminsd_avx(auVar185,auVar193);
  auVar13 = vpminsd_avx(auVar212,auVar132);
  auVar12 = vmaxps_avx(auVar12,auVar13);
  auVar13 = vpminsd_avx(auVar172,auVar107);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar214._4_4_ = uVar4;
  auVar214._0_4_ = uVar4;
  auVar214._8_4_ = uVar4;
  auVar214._12_4_ = uVar4;
  auVar220 = ZEXT1664(auVar214);
  auVar13 = vmaxps_avx(auVar13,auVar214);
  auVar12 = vmaxps_avx(auVar12,auVar13);
  local_2e0._0_4_ = auVar12._0_4_ * 0.99999964;
  local_2e0._4_4_ = auVar12._4_4_ * 0.99999964;
  local_2e0._8_4_ = auVar12._8_4_ * 0.99999964;
  local_2e0._12_4_ = auVar12._12_4_ * 0.99999964;
  auVar12 = vpmaxsd_avx(auVar185,auVar193);
  auVar13 = vpmaxsd_avx(auVar212,auVar132);
  auVar12 = vminps_avx(auVar12,auVar13);
  auVar13 = vpmaxsd_avx(auVar172,auVar107);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar153._4_4_ = uVar4;
  auVar153._0_4_ = uVar4;
  auVar153._8_4_ = uVar4;
  auVar153._12_4_ = uVar4;
  auVar13 = vminps_avx(auVar13,auVar153);
  auVar12 = vminps_avx(auVar12,auVar13);
  auVar108._0_4_ = auVar12._0_4_ * 1.0000004;
  auVar108._4_4_ = auVar12._4_4_ * 1.0000004;
  auVar108._8_4_ = auVar12._8_4_ * 1.0000004;
  auVar108._12_4_ = auVar12._12_4_ * 1.0000004;
  auVar133[4] = PVar8;
  auVar133._5_3_ = 0;
  auVar133[8] = PVar8;
  auVar133._9_3_ = 0;
  auVar133[0xc] = PVar8;
  auVar133._13_3_ = 0;
  auVar13 = vpcmpgtd_avx(auVar133,_DAT_01ff0cf0);
  auVar12 = vcmpps_avx(local_2e0,auVar108,2);
  auVar12 = vandps_avx(auVar12,auVar13);
  uVar96 = vmovmskps_avx(auVar12);
  if (uVar96 != 0) {
    uVar96 = uVar96 & 0xff;
    local_5c0 = mm_lookupmask_ps._16_8_;
    uStack_5b8 = mm_lookupmask_ps._24_8_;
    uStack_5b0 = mm_lookupmask_ps._16_8_;
    uStack_5a8 = mm_lookupmask_ps._24_8_;
    local_6c8 = (undefined1 (*) [32])&local_1c0;
    iVar93 = 1 << ((uint)k & 0x1f);
    auVar110._4_4_ = iVar93;
    auVar110._0_4_ = iVar93;
    auVar110._8_4_ = iVar93;
    auVar110._12_4_ = iVar93;
    auVar110._16_4_ = iVar93;
    auVar110._20_4_ = iVar93;
    auVar110._24_4_ = iVar93;
    auVar110._28_4_ = iVar93;
    auVar118 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar110 = vpand_avx2(auVar110,auVar118);
    local_2c0 = vpcmpeqd_avx2(auVar110,auVar118);
    do {
      auVar110 = auVar220._0_32_;
      auVar118 = auVar226._0_32_;
      lVar20 = 0;
      uVar101 = (ulong)uVar96;
      for (uVar95 = uVar101; (uVar95 & 1) == 0; uVar95 = uVar95 >> 1 | 0x8000000000000000) {
        lVar20 = lVar20 + 1;
      }
      uVar101 = uVar101 - 1 & uVar101;
      uVar4 = *(undefined4 *)(prim + lVar20 * 4 + 6);
      uVar95 = (ulong)(uint)((int)lVar20 << 6);
      uVar96 = *(uint *)(prim + 2);
      pGVar100 = (context->scene->geometries).items[uVar96].ptr;
      pPVar1 = prim + uVar95 + lVar74 + 0x16;
      uVar82 = *(undefined8 *)pPVar1;
      uVar83 = *(undefined8 *)(pPVar1 + 8);
      auVar14 = *(undefined1 (*) [16])pPVar1;
      auVar13 = *(undefined1 (*) [16])pPVar1;
      auVar12 = *(undefined1 (*) [16])pPVar1;
      if (uVar101 != 0) {
        uVar97 = uVar101 - 1 & uVar101;
        for (uVar21 = uVar101; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
        }
        if (uVar97 != 0) {
          for (; (uVar97 & 1) == 0; uVar97 = uVar97 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_6e0 = *(undefined1 (*) [16])(prim + uVar95 + lVar74 + 0x26);
      local_6f0 = *(undefined1 (*) [16])(prim + uVar95 + lVar74 + 0x36);
      _local_700 = *(undefined1 (*) [16])(prim + uVar95 + lVar74 + 0x46);
      iVar93 = (int)pGVar100[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      auVar108 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar16 = vsubps_avx(*(undefined1 (*) [16])pPVar1,auVar108);
      uVar102 = auVar16._0_4_;
      auVar186._4_4_ = uVar102;
      auVar186._0_4_ = uVar102;
      auVar186._8_4_ = uVar102;
      auVar186._12_4_ = uVar102;
      auVar15 = vshufps_avx(auVar16,auVar16,0x55);
      auVar16 = vshufps_avx(auVar16,auVar16,0xaa);
      aVar5 = pre->ray_space[k].vx.field_0;
      aVar6 = pre->ray_space[k].vy.field_0;
      fVar152 = pre->ray_space[k].vz.field_0.m128[0];
      fVar151 = pre->ray_space[k].vz.field_0.m128[1];
      fVar123 = pre->ray_space[k].vz.field_0.m128[2];
      fVar125 = pre->ray_space[k].vz.field_0.m128[3];
      auVar203._0_4_ = fVar152 * auVar16._0_4_;
      auVar203._4_4_ = fVar151 * auVar16._4_4_;
      auVar203._8_4_ = fVar123 * auVar16._8_4_;
      auVar203._12_4_ = fVar125 * auVar16._12_4_;
      auVar15 = vfmadd231ps_fma(auVar203,(undefined1  [16])aVar6,auVar15);
      auVar153 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar5,auVar186);
      auVar15 = vblendps_avx(auVar153,*(undefined1 (*) [16])pPVar1,8);
      auVar17 = vsubps_avx(local_6e0,auVar108);
      uVar102 = auVar17._0_4_;
      auVar204._4_4_ = uVar102;
      auVar204._0_4_ = uVar102;
      auVar204._8_4_ = uVar102;
      auVar204._12_4_ = uVar102;
      auVar16 = vshufps_avx(auVar17,auVar17,0x55);
      auVar17 = vshufps_avx(auVar17,auVar17,0xaa);
      auVar215._0_4_ = fVar152 * auVar17._0_4_;
      auVar215._4_4_ = fVar151 * auVar17._4_4_;
      auVar215._8_4_ = fVar123 * auVar17._8_4_;
      auVar215._12_4_ = fVar125 * auVar17._12_4_;
      auVar16 = vfmadd231ps_fma(auVar215,(undefined1  [16])aVar6,auVar16);
      auVar132 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar5,auVar204);
      auVar16 = vblendps_avx(auVar132,local_6e0,8);
      auVar107 = vsubps_avx(local_6f0,auVar108);
      uVar102 = auVar107._0_4_;
      auVar208._4_4_ = uVar102;
      auVar208._0_4_ = uVar102;
      auVar208._8_4_ = uVar102;
      auVar208._12_4_ = uVar102;
      auVar17 = vshufps_avx(auVar107,auVar107,0x55);
      auVar107 = vshufps_avx(auVar107,auVar107,0xaa);
      auVar229._0_4_ = fVar152 * auVar107._0_4_;
      auVar229._4_4_ = fVar151 * auVar107._4_4_;
      auVar229._8_4_ = fVar123 * auVar107._8_4_;
      auVar229._12_4_ = fVar125 * auVar107._12_4_;
      auVar17 = vfmadd231ps_fma(auVar229,(undefined1  [16])aVar6,auVar17);
      auVar106 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar5,auVar208);
      auVar17 = vblendps_avx(auVar106,local_6f0,8);
      auVar107 = vsubps_avx(_local_700,auVar108);
      uVar102 = auVar107._0_4_;
      auVar209._4_4_ = uVar102;
      auVar209._0_4_ = uVar102;
      auVar209._8_4_ = uVar102;
      auVar209._12_4_ = uVar102;
      auVar108 = vshufps_avx(auVar107,auVar107,0x55);
      auVar107 = vshufps_avx(auVar107,auVar107,0xaa);
      auVar233._0_4_ = fVar152 * auVar107._0_4_;
      auVar233._4_4_ = fVar151 * auVar107._4_4_;
      auVar233._8_4_ = fVar123 * auVar107._8_4_;
      auVar233._12_4_ = fVar125 * auVar107._12_4_;
      auVar108 = vfmadd231ps_fma(auVar233,(undefined1  [16])aVar6,auVar108);
      auVar133 = vfmadd231ps_fma(auVar108,(undefined1  [16])aVar5,auVar209);
      auVar108 = vblendps_avx(auVar133,_local_700,8);
      auVar15 = vandps_avx(auVar15,local_2d0);
      auVar16 = vandps_avx(auVar16,local_2d0);
      auVar107 = vmaxps_avx(auVar15,auVar16);
      auVar15 = vandps_avx(auVar17,local_2d0);
      auVar16 = vandps_avx(auVar108,local_2d0);
      auVar15 = vmaxps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(auVar107,auVar15);
      auVar16 = vmovshdup_avx(auVar15);
      auVar16 = vmaxss_avx(auVar16,auVar15);
      auVar15 = vshufpd_avx(auVar15,auVar15,1);
      auVar15 = vmaxss_avx(auVar15,auVar16);
      lVar20 = (long)iVar93 * 0x44;
      auVar16 = vmovshdup_avx(auVar153);
      uVar104 = auVar16._0_8_;
      local_4e0._8_8_ = uVar104;
      local_4e0._0_8_ = uVar104;
      local_4e0._16_8_ = uVar104;
      local_4e0._24_8_ = uVar104;
      auVar16 = vmovshdup_avx(auVar132);
      uVar104 = auVar16._0_8_;
      local_660._8_8_ = uVar104;
      local_660._0_8_ = uVar104;
      local_660._16_8_ = uVar104;
      local_660._24_8_ = uVar104;
      auVar142 = *(undefined1 (*) [32])(bezier_basis0 + lVar20 + 0x908);
      uVar227 = auVar106._0_4_;
      local_640._4_4_ = uVar227;
      local_640._0_4_ = uVar227;
      local_640._8_4_ = uVar227;
      local_640._12_4_ = uVar227;
      local_640._16_4_ = uVar227;
      local_640._20_4_ = uVar227;
      local_640._24_4_ = uVar227;
      local_640._28_4_ = uVar227;
      auVar16 = vmovshdup_avx(auVar106);
      uVar104 = auVar16._0_8_;
      auVar205._8_8_ = uVar104;
      auVar205._0_8_ = uVar104;
      auVar205._16_8_ = uVar104;
      auVar205._24_8_ = uVar104;
      fVar152 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar20 + 0xd8c);
      auVar90 = *(undefined1 (*) [28])(bezier_basis0 + lVar20 + 0xd8c);
      local_720 = auVar133._0_4_;
      auVar16 = vmovshdup_avx(auVar133);
      local_780 = auVar16._0_8_;
      auVar139._4_4_ = local_720 * *(float *)(bezier_basis0 + lVar20 + 0xd90);
      auVar139._0_4_ = local_720 * fVar152;
      auVar139._8_4_ = local_720 * *(float *)(bezier_basis0 + lVar20 + 0xd94);
      auVar139._12_4_ = local_720 * *(float *)(bezier_basis0 + lVar20 + 0xd98);
      auVar139._16_4_ = local_720 * *(float *)(bezier_basis0 + lVar20 + 0xd9c);
      auVar139._20_4_ = local_720 * *(float *)(bezier_basis0 + lVar20 + 0xda0);
      auVar139._24_4_ = local_720 * *(float *)(bezier_basis0 + lVar20 + 0xda4);
      auVar139._28_4_ = *(undefined4 *)(bezier_basis0 + lVar20 + 0xda8);
      auVar17 = vfmadd231ps_fma(auVar139,auVar142,local_640);
      fVar171 = auVar16._0_4_;
      auVar202._0_4_ = fVar171 * fVar152;
      fVar183 = auVar16._4_4_;
      auVar202._4_4_ = fVar183 * *(float *)(bezier_basis0 + lVar20 + 0xd90);
      auVar202._8_4_ = fVar171 * *(float *)(bezier_basis0 + lVar20 + 0xd94);
      auVar202._12_4_ = fVar183 * *(float *)(bezier_basis0 + lVar20 + 0xd98);
      auVar202._16_4_ = fVar171 * *(float *)(bezier_basis0 + lVar20 + 0xd9c);
      auVar202._20_4_ = fVar183 * *(float *)(bezier_basis0 + lVar20 + 0xda0);
      auVar202._24_4_ = fVar171 * *(float *)(bezier_basis0 + lVar20 + 0xda4);
      auVar202._28_4_ = 0;
      auVar16 = vfmadd231ps_fma(auVar202,auVar142,auVar205);
      auVar139 = *(undefined1 (*) [32])(bezier_basis0 + lVar20 + 0x484);
      uVar102 = auVar132._0_4_;
      local_760._4_4_ = uVar102;
      local_760._0_4_ = uVar102;
      local_760._8_4_ = uVar102;
      local_760._12_4_ = uVar102;
      local_760._16_4_ = uVar102;
      local_760._20_4_ = uVar102;
      local_760._24_4_ = uVar102;
      local_760._28_4_ = uVar102;
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar139,local_760);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar139,local_660);
      auVar202 = *(undefined1 (*) [32])(bezier_basis0 + lVar20);
      local_540._0_4_ = auVar153._0_4_;
      uVar102 = local_540._0_4_;
      auVar241._4_4_ = local_540._0_4_;
      auVar241._0_4_ = local_540._0_4_;
      auVar241._8_4_ = local_540._0_4_;
      auVar241._12_4_ = local_540._0_4_;
      auVar241._16_4_ = local_540._0_4_;
      auVar241._20_4_ = local_540._0_4_;
      auVar241._24_4_ = local_540._0_4_;
      auVar241._28_4_ = local_540._0_4_;
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar202,auVar241);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar202,local_4e0);
      auVar166 = *(undefined1 (*) [32])(bezier_basis1 + lVar20 + 0x908);
      fVar122 = *(float *)(bezier_basis1 + lVar20 + 0xd8c);
      fVar124 = *(float *)(bezier_basis1 + lVar20 + 0xd90);
      fVar126 = *(float *)(bezier_basis1 + lVar20 + 0xd94);
      fVar127 = *(float *)(bezier_basis1 + lVar20 + 0xd98);
      fVar128 = *(float *)(bezier_basis1 + lVar20 + 0xd9c);
      fVar129 = *(float *)(bezier_basis1 + lVar20 + 0xda0);
      fVar170 = *(float *)(bezier_basis1 + lVar20 + 0xda4);
      auVar234._4_4_ = fVar124 * local_720;
      auVar234._0_4_ = fVar122 * local_720;
      auVar234._8_4_ = fVar126 * local_720;
      auVar234._12_4_ = fVar127 * local_720;
      auVar234._16_4_ = fVar128 * local_720;
      auVar234._20_4_ = fVar129 * local_720;
      auVar234._24_4_ = fVar170 * local_720;
      auVar234._28_4_ = *(undefined4 *)(bezier_basis0 + lVar20 + 0xda8);
      auVar108 = vfmadd231ps_fma(auVar234,auVar166,local_640);
      auVar7._4_4_ = fVar124 * fVar183;
      auVar7._0_4_ = fVar122 * fVar171;
      auVar7._8_4_ = fVar126 * fVar171;
      auVar7._12_4_ = fVar127 * fVar183;
      auVar7._16_4_ = fVar128 * fVar171;
      auVar7._20_4_ = fVar129 * fVar183;
      auVar7._24_4_ = fVar170 * fVar171;
      auVar7._28_4_ = uVar227;
      auVar107 = vfmadd231ps_fma(auVar7,auVar166,auVar205);
      auVar234 = *(undefined1 (*) [32])(bezier_basis1 + lVar20 + 0x484);
      auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar234,local_760);
      auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar234,local_660);
      auVar7 = *(undefined1 (*) [32])(bezier_basis1 + lVar20);
      auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar7,auVar241);
      auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar7,local_4e0);
      auVar111 = ZEXT1632(auVar108);
      auVar134 = ZEXT1632(auVar17);
      auVar119 = vsubps_avx(auVar111,auVar134);
      local_300 = ZEXT1632(auVar107);
      local_320 = ZEXT1632(auVar16);
      local_340 = vsubps_avx(local_300,local_320);
      auVar112._0_4_ = auVar16._0_4_ * auVar119._0_4_;
      auVar112._4_4_ = auVar16._4_4_ * auVar119._4_4_;
      auVar112._8_4_ = auVar16._8_4_ * auVar119._8_4_;
      auVar112._12_4_ = auVar16._12_4_ * auVar119._12_4_;
      auVar112._16_4_ = auVar119._16_4_ * 0.0;
      auVar112._20_4_ = auVar119._20_4_ * 0.0;
      auVar112._24_4_ = auVar119._24_4_ * 0.0;
      auVar112._28_4_ = 0;
      fVar152 = local_340._0_4_;
      auVar135._0_4_ = auVar17._0_4_ * fVar152;
      fVar151 = local_340._4_4_;
      auVar135._4_4_ = auVar17._4_4_ * fVar151;
      fVar123 = local_340._8_4_;
      auVar135._8_4_ = auVar17._8_4_ * fVar123;
      fVar125 = local_340._12_4_;
      auVar135._12_4_ = auVar17._12_4_ * fVar125;
      fVar243 = local_340._16_4_;
      auVar135._16_4_ = fVar243 * 0.0;
      fVar244 = local_340._20_4_;
      auVar135._20_4_ = fVar244 * 0.0;
      fVar103 = local_340._24_4_;
      auVar135._24_4_ = fVar103 * 0.0;
      auVar135._28_4_ = 0;
      auVar112 = vsubps_avx(auVar112,auVar135);
      auVar16 = vpermilps_avx(*(undefined1 (*) [16])pPVar1,0xff);
      uVar104 = auVar16._0_8_;
      local_80._8_8_ = uVar104;
      local_80._0_8_ = uVar104;
      local_80._16_8_ = uVar104;
      local_80._24_8_ = uVar104;
      auVar17 = vpermilps_avx(local_6e0,0xff);
      uVar104 = auVar17._0_8_;
      local_a0._8_8_ = uVar104;
      local_a0._0_8_ = uVar104;
      local_a0._16_8_ = uVar104;
      local_a0._24_8_ = uVar104;
      auVar17 = vpermilps_avx(local_6f0,0xff);
      uVar104 = auVar17._0_8_;
      local_c0._8_8_ = uVar104;
      local_c0._0_8_ = uVar104;
      local_c0._16_8_ = uVar104;
      local_c0._24_8_ = uVar104;
      auVar17 = vpermilps_avx(_local_700,0xff);
      local_e0 = auVar17._0_8_;
      local_8c0 = auVar90._0_4_;
      fStack_8bc = auVar90._4_4_;
      fStack_8b8 = auVar90._8_4_;
      fStack_8b4 = auVar90._12_4_;
      fStack_8b0 = auVar90._16_4_;
      fStack_8ac = auVar90._20_4_;
      fStack_8a8 = auVar90._24_4_;
      fVar130 = auVar17._0_4_;
      fVar150 = auVar17._4_4_;
      auVar219._4_4_ = fVar150 * fStack_8bc;
      auVar219._0_4_ = fVar130 * local_8c0;
      auVar219._8_4_ = fVar130 * fStack_8b8;
      auVar219._12_4_ = fVar150 * fStack_8b4;
      auVar219._16_4_ = fVar130 * fStack_8b0;
      auVar219._20_4_ = fVar150 * fStack_8ac;
      auVar219._24_4_ = fVar130 * fStack_8a8;
      auVar219._28_4_ = local_540._0_4_;
      auVar17 = vfmadd231ps_fma(auVar219,local_c0,auVar142);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar139,local_a0);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar202,local_80);
      uStack_d8 = local_e0;
      uStack_d0 = local_e0;
      uStack_c8 = local_e0;
      auVar178._4_4_ = fVar124 * fVar150;
      auVar178._0_4_ = fVar122 * fVar130;
      auVar178._8_4_ = fVar126 * fVar130;
      auVar178._12_4_ = fVar127 * fVar150;
      auVar178._16_4_ = fVar128 * fVar130;
      auVar178._20_4_ = fVar129 * fVar150;
      auVar178._24_4_ = fVar170 * fVar130;
      auVar178._28_4_ = auVar202._28_4_;
      auVar108 = vfmadd231ps_fma(auVar178,auVar166,local_c0);
      auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar234,local_a0);
      auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar7,local_80);
      auVar231._4_4_ = fVar151 * fVar151;
      auVar231._0_4_ = fVar152 * fVar152;
      auVar231._8_4_ = fVar123 * fVar123;
      auVar231._12_4_ = fVar125 * fVar125;
      auVar231._16_4_ = fVar243 * fVar243;
      auVar231._20_4_ = fVar244 * fVar244;
      auVar231._24_4_ = fVar103 * fVar103;
      auVar231._28_4_ = auVar16._4_4_;
      auVar16 = vfmadd231ps_fma(auVar231,auVar119,auVar119);
      auVar219 = vmaxps_avx(ZEXT1632(auVar17),ZEXT1632(auVar108));
      auVar18._4_4_ = auVar219._4_4_ * auVar219._4_4_ * auVar16._4_4_;
      auVar18._0_4_ = auVar219._0_4_ * auVar219._0_4_ * auVar16._0_4_;
      auVar18._8_4_ = auVar219._8_4_ * auVar219._8_4_ * auVar16._8_4_;
      auVar18._12_4_ = auVar219._12_4_ * auVar219._12_4_ * auVar16._12_4_;
      auVar18._16_4_ = auVar219._16_4_ * auVar219._16_4_ * 0.0;
      auVar18._20_4_ = auVar219._20_4_ * auVar219._20_4_ * 0.0;
      auVar18._24_4_ = auVar219._24_4_ * auVar219._24_4_ * 0.0;
      auVar18._28_4_ = auVar219._28_4_;
      auVar19._4_4_ = auVar112._4_4_ * auVar112._4_4_;
      auVar19._0_4_ = auVar112._0_4_ * auVar112._0_4_;
      auVar19._8_4_ = auVar112._8_4_ * auVar112._8_4_;
      auVar19._12_4_ = auVar112._12_4_ * auVar112._12_4_;
      auVar19._16_4_ = auVar112._16_4_ * auVar112._16_4_;
      auVar19._20_4_ = auVar112._20_4_ * auVar112._20_4_;
      auVar19._24_4_ = auVar112._24_4_ * auVar112._24_4_;
      auVar19._28_4_ = auVar112._28_4_;
      auVar219 = vcmpps_avx(auVar19,auVar18,2);
      fVar152 = auVar15._0_4_ * 4.7683716e-07;
      auVar113._0_4_ = (float)iVar93;
      _auStack_4fc = auVar133._4_12_;
      auVar113._4_4_ = auVar113._0_4_;
      auVar113._8_4_ = auVar113._0_4_;
      auVar113._12_4_ = auVar113._0_4_;
      auVar113._16_4_ = auVar113._0_4_;
      auVar113._20_4_ = auVar113._0_4_;
      auVar113._24_4_ = auVar113._0_4_;
      auVar113._28_4_ = auVar113._0_4_;
      auVar112 = vcmpps_avx(_DAT_02020f40,auVar113,1);
      auVar16 = vpermilps_avx(auVar153,0xaa);
      uVar104 = auVar16._0_8_;
      auVar177._8_8_ = uVar104;
      auVar177._0_8_ = uVar104;
      auVar177._16_8_ = uVar104;
      auVar177._24_8_ = uVar104;
      auVar182 = ZEXT3264(auVar177);
      auVar15 = vpermilps_avx(auVar132,0xaa);
      uVar104 = auVar15._0_8_;
      local_100._8_8_ = uVar104;
      local_100._0_8_ = uVar104;
      local_100._16_8_ = uVar104;
      local_100._24_8_ = uVar104;
      auVar15 = vpermilps_avx(auVar106,0xaa);
      uVar104 = auVar15._0_8_;
      local_540._8_8_ = uVar104;
      local_540._0_8_ = uVar104;
      local_540._16_8_ = uVar104;
      local_540._24_8_ = uVar104;
      auVar15 = vshufps_avx(auVar133,auVar133,0xaa);
      uVar104 = auVar15._0_8_;
      register0x00001508 = uVar104;
      local_740 = uVar104;
      register0x00001510 = uVar104;
      register0x00001518 = uVar104;
      auVar237 = ZEXT3264(_local_740);
      auVar178 = auVar112 & auVar219;
      uVar98 = *(uint *)(ray + k * 4 + 0x60);
      _local_620 = ZEXT416(uVar98);
      fVar151 = fVar171;
      fVar123 = fVar183;
      fVar125 = fVar171;
      fVar243 = fVar183;
      fVar244 = fVar171;
      uStack_778 = local_780;
      uStack_770 = local_780;
      uStack_768 = local_780;
      fStack_71c = local_720;
      fStack_718 = local_720;
      fStack_714 = local_720;
      fStack_710 = local_720;
      fStack_70c = local_720;
      fStack_708 = local_720;
      fStack_704 = local_720;
      local_500 = auVar113._0_4_;
      if ((((((((auVar178 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar178 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar178 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar178 >> 0x7f,0) == '\0') &&
            (auVar178 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar178 >> 0xbf,0) == '\0') &&
          (auVar178 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar178[0x1f]) {
        auVar226 = ZEXT3264(auVar118);
        auVar220 = ZEXT3264(auVar110);
        auVar148 = ZEXT3264(local_660);
        auVar210 = ZEXT3264(local_760);
      }
      else {
        local_5a0 = SUB84(pGVar100,0);
        fStack_59c = (float)((ulong)pGVar100 >> 0x20);
        auVar219 = vandps_avx(auVar219,auVar112);
        fVar130 = auVar15._0_4_;
        fVar150 = auVar15._4_4_;
        auVar22._4_4_ = fVar150 * fVar124;
        auVar22._0_4_ = fVar130 * fVar122;
        auVar22._8_4_ = fVar130 * fVar126;
        auVar22._12_4_ = fVar150 * fVar127;
        auVar22._16_4_ = fVar130 * fVar128;
        auVar22._20_4_ = fVar150 * fVar129;
        auVar22._24_4_ = fVar130 * fVar170;
        auVar22._28_4_ = auVar219._28_4_;
        auVar15 = vfmadd213ps_fma(auVar166,local_540,auVar22);
        auVar15 = vfmadd213ps_fma(auVar234,local_100,ZEXT1632(auVar15));
        auVar15 = vfmadd213ps_fma(auVar7,auVar177,ZEXT1632(auVar15));
        auVar114._0_4_ = fVar130 * local_8c0;
        auVar114._4_4_ = fVar150 * fStack_8bc;
        auVar114._8_4_ = fVar130 * fStack_8b8;
        auVar114._12_4_ = fVar150 * fStack_8b4;
        auVar114._16_4_ = fVar130 * fStack_8b0;
        auVar114._20_4_ = fVar150 * fStack_8ac;
        auVar114._24_4_ = fVar130 * fStack_8a8;
        auVar114._28_4_ = 0;
        auVar107 = vfmadd213ps_fma(auVar142,local_540,auVar114);
        auVar107 = vfmadd213ps_fma(auVar139,local_100,ZEXT1632(auVar107));
        auVar142 = *(undefined1 (*) [32])(bezier_basis0 + lVar20 + 0x1210);
        auVar139 = *(undefined1 (*) [32])(bezier_basis0 + lVar20 + 0x1694);
        auVar166 = *(undefined1 (*) [32])(bezier_basis0 + lVar20 + 0x1b18);
        fVar103 = *(float *)(bezier_basis0 + lVar20 + 0x1f9c);
        fVar122 = *(float *)(bezier_basis0 + lVar20 + 0x1fa0);
        fVar124 = *(float *)(bezier_basis0 + lVar20 + 0x1fa4);
        fVar126 = *(float *)(bezier_basis0 + lVar20 + 0x1fa8);
        fVar127 = *(float *)(bezier_basis0 + lVar20 + 0x1fac);
        fVar128 = *(float *)(bezier_basis0 + lVar20 + 0x1fb0);
        fVar129 = *(float *)(bezier_basis0 + lVar20 + 0x1fb4);
        auVar198._0_4_ = local_720 * fVar103;
        auVar198._4_4_ = local_720 * fVar122;
        auVar198._8_4_ = local_720 * fVar124;
        auVar198._12_4_ = local_720 * fVar126;
        auVar198._16_4_ = local_720 * fVar127;
        auVar198._20_4_ = local_720 * fVar128;
        auVar198._24_4_ = local_720 * fVar129;
        auVar198._28_4_ = 0;
        auVar23._4_4_ = fVar183 * fVar122;
        auVar23._0_4_ = fVar171 * fVar103;
        auVar23._8_4_ = fVar171 * fVar124;
        auVar23._12_4_ = fVar183 * fVar126;
        auVar23._16_4_ = fVar171 * fVar127;
        auVar23._20_4_ = fVar183 * fVar128;
        auVar23._24_4_ = fVar171 * fVar129;
        auVar23._28_4_ = *(undefined4 *)(bezier_basis1 + lVar20 + 0xda8);
        auVar24._4_4_ = fVar122 * fVar150;
        auVar24._0_4_ = fVar103 * fVar130;
        auVar24._8_4_ = fVar124 * fVar130;
        auVar24._12_4_ = fVar126 * fVar150;
        auVar24._16_4_ = fVar127 * fVar130;
        auVar24._20_4_ = fVar128 * fVar150;
        auVar24._24_4_ = fVar129 * fVar130;
        auVar24._28_4_ = auVar119._28_4_;
        auVar153 = vfmadd231ps_fma(auVar198,auVar166,local_640);
        auVar132 = vfmadd231ps_fma(auVar23,auVar166,auVar205);
        auVar106 = vfmadd231ps_fma(auVar24,local_540,auVar166);
        auVar153 = vfmadd231ps_fma(ZEXT1632(auVar153),auVar139,local_760);
        auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar139,local_660);
        auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),local_100,auVar139);
        auVar153 = vfmadd231ps_fma(ZEXT1632(auVar153),auVar142,auVar241);
        auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar142,local_4e0);
        auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar177,auVar142);
        fVar103 = *(float *)(bezier_basis1 + lVar20 + 0x1f9c);
        fVar122 = *(float *)(bezier_basis1 + lVar20 + 0x1fa0);
        fVar124 = *(float *)(bezier_basis1 + lVar20 + 0x1fa4);
        fVar126 = *(float *)(bezier_basis1 + lVar20 + 0x1fa8);
        fVar127 = *(float *)(bezier_basis1 + lVar20 + 0x1fac);
        fVar128 = *(float *)(bezier_basis1 + lVar20 + 0x1fb0);
        fVar129 = *(float *)(bezier_basis1 + lVar20 + 0x1fb4);
        auVar166._4_4_ = local_720 * fVar122;
        auVar166._0_4_ = local_720 * fVar103;
        auVar166._8_4_ = local_720 * fVar124;
        auVar166._12_4_ = local_720 * fVar126;
        auVar166._16_4_ = local_720 * fVar127;
        auVar166._20_4_ = local_720 * fVar128;
        auVar166._24_4_ = local_720 * fVar129;
        auVar166._28_4_ = local_720;
        auVar25._4_4_ = fVar183 * fVar122;
        auVar25._0_4_ = fVar171 * fVar103;
        auVar25._8_4_ = fVar171 * fVar124;
        auVar25._12_4_ = fVar183 * fVar126;
        auVar25._16_4_ = fVar171 * fVar127;
        auVar25._20_4_ = fVar183 * fVar128;
        auVar25._24_4_ = fVar171 * fVar129;
        auVar25._28_4_ = fVar183;
        auVar26._4_4_ = fVar122 * fVar150;
        auVar26._0_4_ = fVar103 * fVar130;
        auVar26._8_4_ = fVar124 * fVar130;
        auVar26._12_4_ = fVar126 * fVar150;
        auVar26._16_4_ = fVar127 * fVar130;
        auVar26._20_4_ = fVar128 * fVar150;
        auVar26._24_4_ = fVar129 * fVar130;
        auVar26._28_4_ = auVar16._4_4_;
        auVar142 = *(undefined1 (*) [32])(bezier_basis1 + lVar20 + 0x1b18);
        auVar16 = vfmadd231ps_fma(auVar166,auVar142,local_640);
        auVar133 = vfmadd231ps_fma(auVar25,auVar142,auVar205);
        auVar172 = vfmadd231ps_fma(auVar26,auVar142,local_540);
        auVar142 = *(undefined1 (*) [32])(bezier_basis1 + lVar20 + 0x1694);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar142,local_760);
        auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar142,local_660);
        auVar172 = vfmadd231ps_fma(ZEXT1632(auVar172),local_100,auVar142);
        auVar142 = *(undefined1 (*) [32])(bezier_basis1 + lVar20 + 0x1210);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar142,auVar241);
        auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar142,local_4e0);
        auVar136._8_4_ = 0x7fffffff;
        auVar136._0_8_ = 0x7fffffff7fffffff;
        auVar136._12_4_ = 0x7fffffff;
        auVar136._16_4_ = 0x7fffffff;
        auVar136._20_4_ = 0x7fffffff;
        auVar136._24_4_ = 0x7fffffff;
        auVar136._28_4_ = 0x7fffffff;
        auVar172 = vfmadd231ps_fma(ZEXT1632(auVar172),auVar177,auVar142);
        auVar142 = vandps_avx(ZEXT1632(auVar153),auVar136);
        auVar139 = vandps_avx(ZEXT1632(auVar132),auVar136);
        auVar139 = vmaxps_avx(auVar142,auVar139);
        auVar142 = vandps_avx(ZEXT1632(auVar106),auVar136);
        auVar142 = vmaxps_avx(auVar139,auVar142);
        auVar164._4_4_ = fVar152;
        auVar164._0_4_ = fVar152;
        auVar164._8_4_ = fVar152;
        auVar164._12_4_ = fVar152;
        auVar164._16_4_ = fVar152;
        auVar164._20_4_ = fVar152;
        auVar164._24_4_ = fVar152;
        auVar164._28_4_ = fVar152;
        auVar142 = vcmpps_avx(auVar142,auVar164,1);
        auVar166 = vblendvps_avx(ZEXT1632(auVar153),auVar119,auVar142);
        auVar234 = vblendvps_avx(ZEXT1632(auVar132),local_340,auVar142);
        auVar142 = vandps_avx(ZEXT1632(auVar16),auVar136);
        auVar139 = vandps_avx(ZEXT1632(auVar133),auVar136);
        auVar7 = vmaxps_avx(auVar142,auVar139);
        auVar142 = vandps_avx(ZEXT1632(auVar172),auVar136);
        auVar142 = vmaxps_avx(auVar7,auVar142);
        auVar112 = vcmpps_avx(auVar142,auVar164,1);
        auVar142 = vblendvps_avx(ZEXT1632(auVar16),auVar119,auVar112);
        auVar7 = vblendvps_avx(ZEXT1632(auVar133),local_340,auVar112);
        auVar16 = vfmadd213ps_fma(auVar202,auVar177,ZEXT1632(auVar107));
        auVar107 = vfmadd213ps_fma(auVar166,auVar166,ZEXT832(0) << 0x20);
        auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar234,auVar234);
        auVar202 = vrsqrtps_avx(ZEXT1632(auVar107));
        fVar103 = auVar202._0_4_;
        fVar122 = auVar202._4_4_;
        fVar124 = auVar202._8_4_;
        fVar126 = auVar202._12_4_;
        fVar127 = auVar202._16_4_;
        fVar128 = auVar202._20_4_;
        fVar129 = auVar202._24_4_;
        auVar119._4_4_ = fVar122 * fVar122 * fVar122 * auVar107._4_4_ * -0.5;
        auVar119._0_4_ = fVar103 * fVar103 * fVar103 * auVar107._0_4_ * -0.5;
        auVar119._8_4_ = fVar124 * fVar124 * fVar124 * auVar107._8_4_ * -0.5;
        auVar119._12_4_ = fVar126 * fVar126 * fVar126 * auVar107._12_4_ * -0.5;
        auVar119._16_4_ = fVar127 * fVar127 * fVar127 * -0.0;
        auVar119._20_4_ = fVar128 * fVar128 * fVar128 * -0.0;
        auVar119._24_4_ = fVar129 * fVar129 * fVar129 * -0.0;
        auVar119._28_4_ = 0;
        auVar189._8_4_ = 0x3fc00000;
        auVar189._0_8_ = 0x3fc000003fc00000;
        auVar189._12_4_ = 0x3fc00000;
        auVar189._16_4_ = 0x3fc00000;
        auVar189._20_4_ = 0x3fc00000;
        auVar189._24_4_ = 0x3fc00000;
        auVar189._28_4_ = 0x3fc00000;
        auVar107 = vfmadd231ps_fma(auVar119,auVar189,auVar202);
        fVar103 = auVar107._0_4_;
        fVar122 = auVar107._4_4_;
        auVar27._4_4_ = auVar234._4_4_ * fVar122;
        auVar27._0_4_ = auVar234._0_4_ * fVar103;
        fVar124 = auVar107._8_4_;
        auVar27._8_4_ = auVar234._8_4_ * fVar124;
        fVar126 = auVar107._12_4_;
        auVar27._12_4_ = auVar234._12_4_ * fVar126;
        auVar27._16_4_ = auVar234._16_4_ * 0.0;
        auVar27._20_4_ = auVar234._20_4_ * 0.0;
        auVar27._24_4_ = auVar234._24_4_ * 0.0;
        auVar27._28_4_ = auVar202._28_4_;
        auVar28._4_4_ = -auVar166._4_4_ * fVar122;
        auVar28._0_4_ = -auVar166._0_4_ * fVar103;
        auVar28._8_4_ = -auVar166._8_4_ * fVar124;
        auVar28._12_4_ = -auVar166._12_4_ * fVar126;
        auVar28._16_4_ = -auVar166._16_4_ * 0.0;
        auVar28._20_4_ = -auVar166._20_4_ * 0.0;
        auVar28._24_4_ = -auVar166._24_4_ * 0.0;
        auVar28._28_4_ = auVar139._28_4_;
        auVar107 = vfmadd213ps_fma(auVar142,auVar142,ZEXT832(0) << 0x20);
        auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar7,auVar7);
        auVar139 = vrsqrtps_avx(ZEXT1632(auVar107));
        auVar29._28_4_ = auVar112._28_4_;
        auVar29._0_28_ =
             ZEXT1628(CONCAT412(fVar126 * 0.0,
                                CONCAT48(fVar124 * 0.0,CONCAT44(fVar122 * 0.0,fVar103 * 0.0))));
        fVar103 = auVar139._0_4_;
        fVar122 = auVar139._4_4_;
        fVar124 = auVar139._8_4_;
        fVar126 = auVar139._12_4_;
        fVar127 = auVar139._16_4_;
        fVar128 = auVar139._20_4_;
        fVar129 = auVar139._24_4_;
        auVar30._4_4_ = fVar122 * fVar122 * fVar122 * auVar107._4_4_ * -0.5;
        auVar30._0_4_ = fVar103 * fVar103 * fVar103 * auVar107._0_4_ * -0.5;
        auVar30._8_4_ = fVar124 * fVar124 * fVar124 * auVar107._8_4_ * -0.5;
        auVar30._12_4_ = fVar126 * fVar126 * fVar126 * auVar107._12_4_ * -0.5;
        auVar30._16_4_ = fVar127 * fVar127 * fVar127 * -0.0;
        auVar30._20_4_ = fVar128 * fVar128 * fVar128 * -0.0;
        auVar30._24_4_ = fVar129 * fVar129 * fVar129 * -0.0;
        auVar30._28_4_ = 0;
        auVar107 = vfmadd231ps_fma(auVar30,auVar189,auVar139);
        fVar103 = auVar107._0_4_;
        fVar122 = auVar107._4_4_;
        auVar31._4_4_ = auVar7._4_4_ * fVar122;
        auVar31._0_4_ = auVar7._0_4_ * fVar103;
        fVar124 = auVar107._8_4_;
        auVar31._8_4_ = auVar7._8_4_ * fVar124;
        fVar126 = auVar107._12_4_;
        auVar31._12_4_ = auVar7._12_4_ * fVar126;
        auVar31._16_4_ = auVar7._16_4_ * 0.0;
        auVar31._20_4_ = auVar7._20_4_ * 0.0;
        auVar31._24_4_ = auVar7._24_4_ * 0.0;
        auVar31._28_4_ = 0;
        auVar32._4_4_ = -auVar142._4_4_ * fVar122;
        auVar32._0_4_ = -auVar142._0_4_ * fVar103;
        auVar32._8_4_ = -auVar142._8_4_ * fVar124;
        auVar32._12_4_ = -auVar142._12_4_ * fVar126;
        auVar32._16_4_ = -auVar142._16_4_ * 0.0;
        auVar32._20_4_ = -auVar142._20_4_ * 0.0;
        auVar32._24_4_ = -auVar142._24_4_ * 0.0;
        auVar32._28_4_ = auVar7._28_4_;
        auVar142._28_4_ = auVar139._28_4_;
        auVar142._0_28_ =
             ZEXT1628(CONCAT412(fVar126 * 0.0,
                                CONCAT48(fVar124 * 0.0,CONCAT44(fVar122 * 0.0,fVar103 * 0.0))));
        auVar107 = vfmadd213ps_fma(auVar27,ZEXT1632(auVar17),auVar134);
        auVar139 = ZEXT1632(auVar17);
        auVar153 = vfmadd213ps_fma(auVar28,auVar139,local_320);
        auVar132 = vfmadd213ps_fma(auVar29,auVar139,ZEXT1632(auVar16));
        auVar172 = vfnmadd213ps_fma(auVar27,auVar139,auVar134);
        auVar106 = vfmadd213ps_fma(auVar31,ZEXT1632(auVar108),auVar111);
        auVar185 = vfnmadd213ps_fma(auVar28,auVar139,local_320);
        auVar139 = ZEXT1632(auVar108);
        auVar133 = vfmadd213ps_fma(auVar32,auVar139,local_300);
        auVar135 = ZEXT1632(auVar17);
        auVar184 = vfnmadd231ps_fma(ZEXT1632(auVar16),auVar135,auVar29);
        auVar16 = vfmadd213ps_fma(auVar142,auVar139,ZEXT1632(auVar15));
        auVar105 = vfnmadd213ps_fma(auVar31,auVar139,auVar111);
        auVar131 = vfnmadd213ps_fma(auVar32,auVar139,local_300);
        auVar191 = vfnmadd231ps_fma(ZEXT1632(auVar15),ZEXT1632(auVar108),auVar142);
        auVar142 = vsubps_avx(ZEXT1632(auVar133),ZEXT1632(auVar185));
        auVar139 = vsubps_avx(ZEXT1632(auVar16),ZEXT1632(auVar184));
        auVar111._4_4_ = auVar184._4_4_ * auVar142._4_4_;
        auVar111._0_4_ = auVar184._0_4_ * auVar142._0_4_;
        auVar111._8_4_ = auVar184._8_4_ * auVar142._8_4_;
        auVar111._12_4_ = auVar184._12_4_ * auVar142._12_4_;
        auVar111._16_4_ = auVar142._16_4_ * 0.0;
        auVar111._20_4_ = auVar142._20_4_ * 0.0;
        auVar111._24_4_ = auVar142._24_4_ * 0.0;
        auVar111._28_4_ = 0;
        auVar17 = vfmsub231ps_fma(auVar111,ZEXT1632(auVar185),auVar139);
        auVar134._4_4_ = auVar172._4_4_ * auVar139._4_4_;
        auVar134._0_4_ = auVar172._0_4_ * auVar139._0_4_;
        auVar134._8_4_ = auVar172._8_4_ * auVar139._8_4_;
        auVar134._12_4_ = auVar172._12_4_ * auVar139._12_4_;
        auVar134._16_4_ = auVar139._16_4_ * 0.0;
        auVar134._20_4_ = auVar139._20_4_ * 0.0;
        auVar134._24_4_ = auVar139._24_4_ * 0.0;
        auVar134._28_4_ = auVar139._28_4_;
        auVar112 = ZEXT1632(auVar172);
        auVar139 = vsubps_avx(ZEXT1632(auVar106),auVar112);
        auVar15 = vfmsub231ps_fma(auVar134,ZEXT1632(auVar184),auVar139);
        auVar33._4_4_ = auVar185._4_4_ * auVar139._4_4_;
        auVar33._0_4_ = auVar185._0_4_ * auVar139._0_4_;
        auVar33._8_4_ = auVar185._8_4_ * auVar139._8_4_;
        auVar33._12_4_ = auVar185._12_4_ * auVar139._12_4_;
        auVar33._16_4_ = auVar139._16_4_ * 0.0;
        auVar33._20_4_ = auVar139._20_4_ * 0.0;
        auVar33._24_4_ = auVar139._24_4_ * 0.0;
        auVar33._28_4_ = auVar139._28_4_;
        auVar172 = vfmsub231ps_fma(auVar33,auVar112,auVar142);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar172),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
        auVar178 = vcmpps_avx(ZEXT1632(auVar15),ZEXT832(0) << 0x20,2);
        auVar182 = ZEXT3264(auVar178);
        auVar142 = vblendvps_avx(ZEXT1632(auVar105),ZEXT1632(auVar107),auVar178);
        auVar139 = vblendvps_avx(ZEXT1632(auVar131),ZEXT1632(auVar153),auVar178);
        auVar202 = vblendvps_avx(ZEXT1632(auVar191),ZEXT1632(auVar132),auVar178);
        auVar166 = vblendvps_avx(auVar112,ZEXT1632(auVar106),auVar178);
        auVar234 = vblendvps_avx(ZEXT1632(auVar185),ZEXT1632(auVar133),auVar178);
        auVar7 = vblendvps_avx(ZEXT1632(auVar184),ZEXT1632(auVar16),auVar178);
        auVar112 = vblendvps_avx(ZEXT1632(auVar106),auVar112,auVar178);
        auVar119 = vblendvps_avx(ZEXT1632(auVar133),ZEXT1632(auVar185),auVar178);
        auVar15 = vpackssdw_avx(auVar219._0_16_,auVar219._16_16_);
        auVar219 = vblendvps_avx(ZEXT1632(auVar16),ZEXT1632(auVar184),auVar178);
        auVar231 = vsubps_avx(auVar112,auVar142);
        auVar119 = vsubps_avx(auVar119,auVar139);
        auVar18 = vsubps_avx(auVar219,auVar202);
        auVar19 = vsubps_avx(auVar142,auVar166);
        auVar111 = vsubps_avx(auVar139,auVar234);
        auVar134 = vsubps_avx(auVar202,auVar7);
        auVar34._4_4_ = auVar18._4_4_ * auVar142._4_4_;
        auVar34._0_4_ = auVar18._0_4_ * auVar142._0_4_;
        auVar34._8_4_ = auVar18._8_4_ * auVar142._8_4_;
        auVar34._12_4_ = auVar18._12_4_ * auVar142._12_4_;
        auVar34._16_4_ = auVar18._16_4_ * auVar142._16_4_;
        auVar34._20_4_ = auVar18._20_4_ * auVar142._20_4_;
        auVar34._24_4_ = auVar18._24_4_ * auVar142._24_4_;
        auVar34._28_4_ = auVar219._28_4_;
        auVar16 = vfmsub231ps_fma(auVar34,auVar202,auVar231);
        auVar35._4_4_ = auVar231._4_4_ * auVar139._4_4_;
        auVar35._0_4_ = auVar231._0_4_ * auVar139._0_4_;
        auVar35._8_4_ = auVar231._8_4_ * auVar139._8_4_;
        auVar35._12_4_ = auVar231._12_4_ * auVar139._12_4_;
        auVar35._16_4_ = auVar231._16_4_ * auVar139._16_4_;
        auVar35._20_4_ = auVar231._20_4_ * auVar139._20_4_;
        auVar35._24_4_ = auVar231._24_4_ * auVar139._24_4_;
        auVar35._28_4_ = auVar112._28_4_;
        auVar17 = vfmsub231ps_fma(auVar35,auVar142,auVar119);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
        auVar115._0_4_ = auVar119._0_4_ * auVar202._0_4_;
        auVar115._4_4_ = auVar119._4_4_ * auVar202._4_4_;
        auVar115._8_4_ = auVar119._8_4_ * auVar202._8_4_;
        auVar115._12_4_ = auVar119._12_4_ * auVar202._12_4_;
        auVar115._16_4_ = auVar119._16_4_ * auVar202._16_4_;
        auVar115._20_4_ = auVar119._20_4_ * auVar202._20_4_;
        auVar115._24_4_ = auVar119._24_4_ * auVar202._24_4_;
        auVar115._28_4_ = 0;
        auVar17 = vfmsub231ps_fma(auVar115,auVar139,auVar18);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
        auVar116._0_4_ = auVar134._0_4_ * auVar166._0_4_;
        auVar116._4_4_ = auVar134._4_4_ * auVar166._4_4_;
        auVar116._8_4_ = auVar134._8_4_ * auVar166._8_4_;
        auVar116._12_4_ = auVar134._12_4_ * auVar166._12_4_;
        auVar116._16_4_ = auVar134._16_4_ * auVar166._16_4_;
        auVar116._20_4_ = auVar134._20_4_ * auVar166._20_4_;
        auVar116._24_4_ = auVar134._24_4_ * auVar166._24_4_;
        auVar116._28_4_ = 0;
        auVar16 = vfmsub231ps_fma(auVar116,auVar19,auVar7);
        auVar36._4_4_ = auVar111._4_4_ * auVar7._4_4_;
        auVar36._0_4_ = auVar111._0_4_ * auVar7._0_4_;
        auVar36._8_4_ = auVar111._8_4_ * auVar7._8_4_;
        auVar36._12_4_ = auVar111._12_4_ * auVar7._12_4_;
        auVar36._16_4_ = auVar111._16_4_ * auVar7._16_4_;
        auVar36._20_4_ = auVar111._20_4_ * auVar7._20_4_;
        auVar36._24_4_ = auVar111._24_4_ * auVar7._24_4_;
        auVar36._28_4_ = auVar7._28_4_;
        auVar107 = vfmsub231ps_fma(auVar36,auVar234,auVar134);
        auVar37._4_4_ = auVar19._4_4_ * auVar234._4_4_;
        auVar37._0_4_ = auVar19._0_4_ * auVar234._0_4_;
        auVar37._8_4_ = auVar19._8_4_ * auVar234._8_4_;
        auVar37._12_4_ = auVar19._12_4_ * auVar234._12_4_;
        auVar37._16_4_ = auVar19._16_4_ * auVar234._16_4_;
        auVar37._20_4_ = auVar19._20_4_ * auVar234._20_4_;
        auVar37._24_4_ = auVar19._24_4_ * auVar234._24_4_;
        auVar37._28_4_ = auVar234._28_4_;
        auVar153 = vfmsub231ps_fma(auVar37,auVar111,auVar166);
        auVar234 = ZEXT832(0) << 0x20;
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar153),auVar234,ZEXT1632(auVar16));
        auVar107 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar234,ZEXT1632(auVar107));
        auVar166 = vmaxps_avx(ZEXT1632(auVar17),ZEXT1632(auVar107));
        auVar166 = vcmpps_avx(auVar166,ZEXT832(0) << 0x20,2);
        auVar16 = vpackssdw_avx(auVar166._0_16_,auVar166._16_16_);
        auVar15 = vpand_avx(auVar15,auVar16);
        auVar166 = vpmovsxwd_avx2(auVar15);
        if ((((((((auVar166 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar166 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar166 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar166 >> 0x7f,0) == '\0') &&
              (auVar166 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar166 >> 0xbf,0) == '\0') &&
            (auVar166 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar166[0x1f]) {
LAB_0164e0df:
          auVar210 = ZEXT3264(CONCAT824(uStack_5a8,
                                        CONCAT816(uStack_5b0,CONCAT88(uStack_5b8,local_5c0))));
          auVar226 = ZEXT3264(auVar118);
          auVar220 = ZEXT3264(auVar110);
        }
        else {
          auVar38._4_4_ = auVar119._4_4_ * auVar134._4_4_;
          auVar38._0_4_ = auVar119._0_4_ * auVar134._0_4_;
          auVar38._8_4_ = auVar119._8_4_ * auVar134._8_4_;
          auVar38._12_4_ = auVar119._12_4_ * auVar134._12_4_;
          auVar38._16_4_ = auVar119._16_4_ * auVar134._16_4_;
          auVar38._20_4_ = auVar119._20_4_ * auVar134._20_4_;
          auVar38._24_4_ = auVar119._24_4_ * auVar134._24_4_;
          auVar38._28_4_ = auVar166._28_4_;
          auVar106 = vfmsub231ps_fma(auVar38,auVar111,auVar18);
          auVar137._0_4_ = auVar19._0_4_ * auVar18._0_4_;
          auVar137._4_4_ = auVar19._4_4_ * auVar18._4_4_;
          auVar137._8_4_ = auVar19._8_4_ * auVar18._8_4_;
          auVar137._12_4_ = auVar19._12_4_ * auVar18._12_4_;
          auVar137._16_4_ = auVar19._16_4_ * auVar18._16_4_;
          auVar137._20_4_ = auVar19._20_4_ * auVar18._20_4_;
          auVar137._24_4_ = auVar19._24_4_ * auVar18._24_4_;
          auVar137._28_4_ = 0;
          auVar132 = vfmsub231ps_fma(auVar137,auVar231,auVar134);
          auVar39._4_4_ = auVar231._4_4_ * auVar111._4_4_;
          auVar39._0_4_ = auVar231._0_4_ * auVar111._0_4_;
          auVar39._8_4_ = auVar231._8_4_ * auVar111._8_4_;
          auVar39._12_4_ = auVar231._12_4_ * auVar111._12_4_;
          auVar39._16_4_ = auVar231._16_4_ * auVar111._16_4_;
          auVar39._20_4_ = auVar231._20_4_ * auVar111._20_4_;
          auVar39._24_4_ = auVar231._24_4_ * auVar111._24_4_;
          auVar39._28_4_ = auVar231._28_4_;
          auVar133 = vfmsub231ps_fma(auVar39,auVar19,auVar119);
          auVar16 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar132),ZEXT1632(auVar133));
          auVar153 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT1632(auVar106),auVar234);
          auVar166 = vrcpps_avx(ZEXT1632(auVar153));
          auVar230._8_4_ = 0x3f800000;
          auVar230._0_8_ = &DAT_3f8000003f800000;
          auVar230._12_4_ = 0x3f800000;
          auVar230._16_4_ = 0x3f800000;
          auVar230._20_4_ = 0x3f800000;
          auVar230._24_4_ = 0x3f800000;
          auVar230._28_4_ = 0x3f800000;
          auVar16 = vfnmadd213ps_fma(auVar166,ZEXT1632(auVar153),auVar230);
          auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar166,auVar166);
          auVar40._4_4_ = auVar133._4_4_ * auVar202._4_4_;
          auVar40._0_4_ = auVar133._0_4_ * auVar202._0_4_;
          auVar40._8_4_ = auVar133._8_4_ * auVar202._8_4_;
          auVar40._12_4_ = auVar133._12_4_ * auVar202._12_4_;
          auVar40._16_4_ = auVar202._16_4_ * 0.0;
          auVar40._20_4_ = auVar202._20_4_ * 0.0;
          auVar40._24_4_ = auVar202._24_4_ * 0.0;
          auVar40._28_4_ = auVar202._28_4_;
          auVar132 = vfmadd231ps_fma(auVar40,auVar139,ZEXT1632(auVar132));
          auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),ZEXT1632(auVar106),auVar142);
          fVar103 = auVar16._0_4_;
          fVar122 = auVar16._4_4_;
          fVar124 = auVar16._8_4_;
          fVar126 = auVar16._12_4_;
          auVar41._28_4_ = auVar139._28_4_;
          auVar41._0_28_ =
               ZEXT1628(CONCAT412(fVar126 * auVar132._12_4_,
                                  CONCAT48(fVar124 * auVar132._8_4_,
                                           CONCAT44(fVar122 * auVar132._4_4_,
                                                    fVar103 * auVar132._0_4_))));
          auVar117._4_4_ = uVar98;
          auVar117._0_4_ = uVar98;
          auVar117._8_4_ = uVar98;
          auVar117._12_4_ = uVar98;
          auVar117._16_4_ = uVar98;
          auVar117._20_4_ = uVar98;
          auVar117._24_4_ = uVar98;
          auVar117._28_4_ = uVar98;
          uVar227 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar138._4_4_ = uVar227;
          auVar138._0_4_ = uVar227;
          auVar138._8_4_ = uVar227;
          auVar138._12_4_ = uVar227;
          auVar138._16_4_ = uVar227;
          auVar138._20_4_ = uVar227;
          auVar138._24_4_ = uVar227;
          auVar138._28_4_ = uVar227;
          auVar142 = vcmpps_avx(auVar117,auVar41,2);
          auVar139 = vcmpps_avx(auVar41,auVar138,2);
          auVar142 = vandps_avx(auVar139,auVar142);
          auVar16 = vpackssdw_avx(auVar142._0_16_,auVar142._16_16_);
          auVar15 = vpand_avx(auVar15,auVar16);
          auVar142 = vpmovsxwd_avx2(auVar15);
          if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar142 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar142 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar142 >> 0x7f,0) == '\0') &&
                (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar142 >> 0xbf,0) == '\0') &&
              (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar142[0x1f]) goto LAB_0164e0df;
          auVar142 = vcmpps_avx(auVar234,ZEXT1632(auVar153),4);
          auVar16 = vpackssdw_avx(auVar142._0_16_,auVar142._16_16_);
          auVar15 = vpand_avx(auVar15,auVar16);
          auVar142 = vpmovsxwd_avx2(auVar15);
          auVar210 = ZEXT3264(CONCAT824(uStack_5a8,
                                        CONCAT816(uStack_5b0,CONCAT88(uStack_5b8,local_5c0))));
          auVar226 = ZEXT3264(auVar118);
          auVar220 = ZEXT3264(auVar110);
          if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar142 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar142 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar142 >> 0x7f,0) != '\0') ||
                (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar142 >> 0xbf,0) != '\0') ||
              (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar142[0x1f] < '\0') {
            auVar118 = ZEXT1632(CONCAT412(fVar126 * auVar17._12_4_,
                                          CONCAT48(fVar124 * auVar17._8_4_,
                                                   CONCAT44(fVar122 * auVar17._4_4_,
                                                            fVar103 * auVar17._0_4_))));
            auVar139 = ZEXT1632(CONCAT412(fVar126 * auVar107._12_4_,
                                          CONCAT48(fVar124 * auVar107._8_4_,
                                                   CONCAT44(fVar122 * auVar107._4_4_,
                                                            fVar103 * auVar107._0_4_))));
            auVar190._8_4_ = 0x3f800000;
            auVar190._0_8_ = &DAT_3f8000003f800000;
            auVar190._12_4_ = 0x3f800000;
            auVar190._16_4_ = 0x3f800000;
            auVar190._20_4_ = 0x3f800000;
            auVar190._24_4_ = 0x3f800000;
            auVar190._28_4_ = 0x3f800000;
            auVar110 = vsubps_avx(auVar190,auVar118);
            auVar110 = vblendvps_avx(auVar110,auVar118,auVar178);
            auVar226 = ZEXT3264(auVar110);
            auVar110 = vsubps_avx(auVar190,auVar139);
            local_360 = vblendvps_avx(auVar110,auVar139,auVar178);
            auVar210 = ZEXT3264(auVar142);
            auVar220 = ZEXT3264(auVar41);
          }
        }
        auVar237 = ZEXT3264(_local_740);
        auVar148 = ZEXT3264(auVar177);
        auVar110 = auVar210._0_32_;
        if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar110 >> 0x7f,0) != '\0') ||
              (auVar210 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar110 >> 0xbf,0) != '\0') ||
            (auVar210 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar210[0x1f] < '\0') {
          auVar118 = vsubps_avx(ZEXT1632(auVar108),auVar135);
          auVar202 = auVar226._0_32_;
          auVar15 = vfmadd213ps_fma(auVar118,auVar202,auVar135);
          fVar103 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
          auVar118._4_4_ = (auVar15._4_4_ + auVar15._4_4_) * fVar103;
          auVar118._0_4_ = (auVar15._0_4_ + auVar15._0_4_) * fVar103;
          auVar118._8_4_ = (auVar15._8_4_ + auVar15._8_4_) * fVar103;
          auVar118._12_4_ = (auVar15._12_4_ + auVar15._12_4_) * fVar103;
          auVar118._16_4_ = fVar103 * 0.0;
          auVar118._20_4_ = fVar103 * 0.0;
          auVar118._24_4_ = fVar103 * 0.0;
          auVar118._28_4_ = 0;
          auVar139 = auVar220._0_32_;
          auVar118 = vcmpps_avx(auVar139,auVar118,6);
          auVar142 = auVar110 & auVar118;
          auVar210 = ZEXT3264(local_760);
          if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar142 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar142 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar142 >> 0x7f,0) != '\0') ||
                (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar142 >> 0xbf,0) != '\0') ||
              (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar142[0x1f] < '\0') {
            local_400 = vandps_avx(auVar118,auVar110);
            auVar140._8_4_ = 0xbf800000;
            auVar140._0_8_ = 0xbf800000bf800000;
            auVar140._12_4_ = 0xbf800000;
            auVar140._16_4_ = 0xbf800000;
            auVar140._20_4_ = 0xbf800000;
            auVar140._24_4_ = 0xbf800000;
            auVar140._28_4_ = 0xbf800000;
            auVar165._8_4_ = 0x40000000;
            auVar165._0_8_ = 0x4000000040000000;
            auVar165._12_4_ = 0x40000000;
            auVar165._16_4_ = 0x40000000;
            auVar165._20_4_ = 0x40000000;
            auVar165._24_4_ = 0x40000000;
            auVar165._28_4_ = 0x40000000;
            auVar15 = vfmadd213ps_fma(local_360,auVar165,auVar140);
            auVar182 = ZEXT1664(auVar15);
            local_4a0 = ZEXT1632(auVar15);
            local_360 = local_4a0;
            auVar110 = local_360;
            local_460 = 0;
            local_440 = local_6e0._0_8_;
            uStack_438 = local_6e0._8_8_;
            local_430 = local_6f0._0_8_;
            uStack_428 = local_6f0._8_8_;
            local_420 = local_700;
            uStack_418 = uStack_6f8;
            local_360 = auVar110;
            if ((pGVar100->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              fVar151 = 1.0 / auVar113._0_4_;
              local_3e0[0] = fVar151 * (auVar226._0_4_ + 0.0);
              local_3e0[1] = fVar151 * (auVar226._4_4_ + 1.0);
              local_3e0[2] = fVar151 * (auVar226._8_4_ + 2.0);
              local_3e0[3] = fVar151 * (auVar226._12_4_ + 3.0);
              fStack_3d0 = fVar151 * (auVar226._16_4_ + 4.0);
              fStack_3cc = fVar151 * (auVar226._20_4_ + 5.0);
              fStack_3c8 = fVar151 * (auVar226._24_4_ + 6.0);
              fStack_3c4 = auVar226._28_4_ + 7.0;
              local_360._0_8_ = auVar15._0_8_;
              local_360._8_8_ = auVar15._8_8_;
              local_3c0 = local_360._0_8_;
              uStack_3b8 = local_360._8_8_;
              uStack_3b0 = 0;
              uStack_3a8 = 0;
              local_3a0 = auVar139;
              auVar141._8_4_ = 0x7f800000;
              auVar141._0_8_ = 0x7f8000007f800000;
              auVar141._12_4_ = 0x7f800000;
              auVar141._16_4_ = 0x7f800000;
              auVar141._20_4_ = 0x7f800000;
              auVar141._24_4_ = 0x7f800000;
              auVar141._28_4_ = 0x7f800000;
              auVar110 = vblendvps_avx(auVar141,auVar139,local_400);
              auVar118 = vshufps_avx(auVar110,auVar110,0xb1);
              auVar118 = vminps_avx(auVar110,auVar118);
              auVar142 = vshufpd_avx(auVar118,auVar118,5);
              auVar118 = vminps_avx(auVar118,auVar142);
              auVar142 = vpermpd_avx2(auVar118,0x4e);
              auVar118 = vminps_avx(auVar118,auVar142);
              auVar118 = vcmpps_avx(auVar110,auVar118,0);
              auVar142 = local_400 & auVar118;
              auVar110 = local_400;
              if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar142 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar142 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar142 >> 0x7f,0) != '\0') ||
                    (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar142 >> 0xbf,0) != '\0') ||
                  (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar142[0x1f] < '\0') {
                auVar110 = vandps_avx(auVar118,local_400);
              }
              uVar94 = vmovmskps_avx(auVar110);
              uVar98 = 0;
              for (; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x80000000) {
                uVar98 = uVar98 + 1;
              }
              uVar95 = (ulong)uVar98;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar100->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar151 = local_3e0[uVar95];
                uVar227 = *(undefined4 *)((long)&local_3c0 + uVar95 * 4);
                fVar125 = 1.0 - fVar151;
                fVar123 = fVar125 * fVar125 * -3.0;
                auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar125 * fVar125)),
                                          ZEXT416((uint)(fVar151 * fVar125)),ZEXT416(0xc0000000));
                auVar15 = vfmsub132ss_fma(ZEXT416((uint)(fVar151 * fVar125)),
                                          ZEXT416((uint)(fVar151 * fVar151)),ZEXT416(0x40000000));
                fVar125 = auVar12._0_4_ * 3.0;
                fVar243 = auVar15._0_4_ * 3.0;
                fVar244 = fVar151 * fVar151 * 3.0;
                auVar194._0_4_ = fVar244 * (float)local_700._0_4_;
                auVar194._4_4_ = fVar244 * (float)local_700._4_4_;
                auVar194._8_4_ = fVar244 * (float)uStack_6f8;
                auVar194._12_4_ = fVar244 * uStack_6f8._4_4_;
                auVar154._4_4_ = fVar243;
                auVar154._0_4_ = fVar243;
                auVar154._8_4_ = fVar243;
                auVar154._12_4_ = fVar243;
                auVar12 = vfmadd132ps_fma(auVar154,auVar194,local_6f0);
                auVar173._4_4_ = fVar125;
                auVar173._0_4_ = fVar125;
                auVar173._8_4_ = fVar125;
                auVar173._12_4_ = fVar125;
                auVar12 = vfmadd132ps_fma(auVar173,auVar12,local_6e0);
                auVar155._4_4_ = fVar123;
                auVar155._0_4_ = fVar123;
                auVar155._8_4_ = fVar123;
                auVar155._12_4_ = fVar123;
                auVar12 = vfmadd132ps_fma(auVar155,auVar12,*(undefined1 (*) [16])pPVar1);
                auVar182 = ZEXT464(*(uint *)(local_3a0 + uVar95 * 4));
                *(uint *)(ray + k * 4 + 0x100) = *(uint *)(local_3a0 + uVar95 * 4);
                *(int *)(ray + k * 4 + 0x180) = auVar12._0_4_;
                uVar9 = vextractps_avx(auVar12,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar9;
                uVar9 = vextractps_avx(auVar12,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar9;
                *(float *)(ray + k * 4 + 0x1e0) = fVar151;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar227;
                *(undefined4 *)(ray + k * 4 + 0x220) = uVar4;
                *(uint *)(ray + k * 4 + 0x240) = uVar96;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              }
              else {
                local_880 = CONCAT44(uVar96,uVar96);
                uStack_878._0_4_ = uVar96;
                uStack_878._4_4_ = uVar96;
                uStack_870._0_4_ = uVar96;
                uStack_870._4_4_ = uVar96;
                auVar92 = _local_880;
                uStack_868._0_4_ = uVar96;
                uStack_868._4_4_ = uVar96;
                auVar110 = _local_880;
                local_680._4_4_ = uVar4;
                local_680._0_4_ = uVar4;
                local_680._8_4_ = uVar4;
                local_680._12_4_ = uVar4;
                local_680._16_4_ = uVar4;
                local_680._20_4_ = uVar4;
                local_680._24_4_ = uVar4;
                local_680._28_4_ = uVar4;
                local_6a0 = ZEXT1632(local_6e0);
                local_560 = ZEXT1632(local_6f0);
                _local_580 = ZEXT1632(_local_700);
                local_6c0 = auVar177;
                local_600 = local_400;
                local_4c0 = auVar202;
                local_480 = auVar139;
                local_45c = iVar93;
                local_450 = uVar82;
                uStack_448 = uVar83;
                do {
                  uVar227 = *(undefined4 *)(ray + k * 4 + 0x100);
                  local_240 = local_3e0[uVar95];
                  uVar9 = *(undefined4 *)((long)&local_3c0 + uVar95 * 4);
                  local_220._4_4_ = uVar9;
                  local_220._0_4_ = uVar9;
                  local_220._8_4_ = uVar9;
                  local_220._12_4_ = uVar9;
                  local_220._16_4_ = uVar9;
                  local_220._20_4_ = uVar9;
                  local_220._24_4_ = uVar9;
                  local_220._28_4_ = uVar9;
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3a0 + uVar95 * 4);
                  fVar125 = 1.0 - local_240;
                  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar125 * fVar125)),
                                            ZEXT416((uint)(local_240 * fVar125)),ZEXT416(0xc0000000)
                                           );
                  auVar15 = vfmsub132ss_fma(ZEXT416((uint)(local_240 * fVar125)),
                                            ZEXT416((uint)(local_240 * local_240)),
                                            ZEXT416(0x40000000));
                  fVar151 = auVar15._0_4_ * 3.0;
                  fVar123 = local_240 * local_240 * 3.0;
                  auVar197._0_4_ = fVar123 * (float)local_580._0_4_;
                  auVar197._4_4_ = fVar123 * (float)local_580._4_4_;
                  auVar197._8_4_ = fVar123 * fStack_578;
                  auVar197._12_4_ = fVar123 * fStack_574;
                  auVar161._4_4_ = fVar151;
                  auVar161._0_4_ = fVar151;
                  auVar161._8_4_ = fVar151;
                  auVar161._12_4_ = fVar151;
                  auVar15 = vfmadd132ps_fma(auVar161,auVar197,local_560._0_16_);
                  fVar151 = auVar16._0_4_ * 3.0;
                  auVar188._4_4_ = fVar151;
                  auVar188._0_4_ = fVar151;
                  auVar188._8_4_ = fVar151;
                  auVar188._12_4_ = fVar151;
                  auVar15 = vfmadd132ps_fma(auVar188,auVar15,local_6a0._0_16_);
                  fVar151 = fVar125 * fVar125 * -3.0;
                  local_7b0.context = context->user;
                  auVar162._4_4_ = fVar151;
                  auVar162._0_4_ = fVar151;
                  auVar162._8_4_ = fVar151;
                  auVar162._12_4_ = fVar151;
                  auVar16 = vfmadd132ps_fma(auVar162,auVar15,auVar12);
                  local_2a0 = auVar16._0_4_;
                  uStack_29c = local_2a0;
                  uStack_298 = local_2a0;
                  uStack_294 = local_2a0;
                  uStack_290 = local_2a0;
                  uStack_28c = local_2a0;
                  uStack_288 = local_2a0;
                  uStack_284 = local_2a0;
                  auVar15 = vmovshdup_avx(auVar16);
                  auVar176._0_8_ = auVar15._0_8_;
                  auVar176._8_8_ = auVar176._0_8_;
                  local_280._16_8_ = auVar176._0_8_;
                  local_280._0_16_ = auVar176;
                  local_280._24_8_ = auVar176._0_8_;
                  auVar182 = ZEXT3264(local_280);
                  auVar15 = vshufps_avx(auVar16,auVar16,0xaa);
                  auVar163._0_8_ = auVar15._0_8_;
                  auVar163._8_8_ = auVar163._0_8_;
                  auVar169._16_8_ = auVar163._0_8_;
                  auVar169._0_16_ = auVar163;
                  auVar169._24_8_ = auVar163._0_8_;
                  local_260 = auVar169;
                  fStack_23c = local_240;
                  fStack_238 = local_240;
                  fStack_234 = local_240;
                  fStack_230 = local_240;
                  fStack_22c = local_240;
                  fStack_228 = local_240;
                  fStack_224 = local_240;
                  local_200 = local_680._0_8_;
                  uStack_1f8 = local_680._8_8_;
                  uStack_1f0 = local_680._16_8_;
                  uStack_1e8 = local_680._24_8_;
                  uStack_870 = auVar92._16_8_;
                  uStack_868 = auVar110._24_8_;
                  local_1e0 = local_880;
                  uStack_1d8 = uStack_878;
                  uStack_1d0 = uStack_870;
                  uStack_1c8 = uStack_868;
                  auVar118 = vpcmpeqd_avx2(local_220,local_220);
                  local_6c8[1] = auVar118;
                  *local_6c8 = auVar118;
                  local_1c0 = (local_7b0.context)->instID[0];
                  uStack_1bc = local_1c0;
                  uStack_1b8 = local_1c0;
                  uStack_1b4 = local_1c0;
                  uStack_1b0 = local_1c0;
                  uStack_1ac = local_1c0;
                  uStack_1a8 = local_1c0;
                  uStack_1a4 = local_1c0;
                  local_1a0 = (local_7b0.context)->instPrimID[0];
                  uStack_19c = local_1a0;
                  uStack_198 = local_1a0;
                  uStack_194 = local_1a0;
                  uStack_190 = local_1a0;
                  uStack_18c = local_1a0;
                  uStack_188 = local_1a0;
                  uStack_184 = local_1a0;
                  local_5e0 = local_2c0._0_8_;
                  uStack_5d8 = local_2c0._8_8_;
                  uStack_5d0 = local_2c0._16_8_;
                  uStack_5c8 = local_2c0._24_8_;
                  local_7b0.valid = (int *)&local_5e0;
                  local_7b0.geometryUserPtr = *(void **)(CONCAT44(fStack_59c,local_5a0) + 0x18);
                  local_7b0.hit = (RTCHitN *)&local_2a0;
                  local_7b0.N = 8;
                  pcVar11 = *(code **)(CONCAT44(fStack_59c,local_5a0) + 0x40);
                  local_7b0.ray = (RTCRayN *)ray;
                  if (pcVar11 != (code *)0x0) {
                    auVar169 = ZEXT1632(auVar163);
                    auVar182 = ZEXT1664(auVar176);
                    (*pcVar11)(&local_7b0);
                    auVar149._8_56_ = extraout_var_00;
                    auVar149._0_8_ = extraout_XMM1_Qa_00;
                    auVar237 = ZEXT3264(_local_740);
                    auVar148 = ZEXT3264(local_6c0);
                    auVar210 = ZEXT3264(local_760);
                    auVar220 = ZEXT3264(auVar139);
                    auVar226 = ZEXT3264(auVar202);
                    auVar118 = vpcmpeqd_avx2(auVar149._0_32_,auVar149._0_32_);
                  }
                  auVar86._8_8_ = uStack_5d8;
                  auVar86._0_8_ = local_5e0;
                  auVar86._16_8_ = uStack_5d0;
                  auVar86._24_8_ = uStack_5c8;
                  auVar166 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar86);
                  auVar142 = auVar118 & ~auVar166;
                  if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar142 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar142 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar142 >> 0x7f,0) == '\0') &&
                        (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar142 >> 0xbf,0) == '\0') &&
                      (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar142[0x1f]) {
                    auVar166 = auVar166 ^ auVar118;
                  }
                  else {
                    p_Var10 = context->args->filter;
                    if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(CONCAT44(fStack_59c,local_5a0) + 0x3e) & 0x40) != 0)))) {
                      auVar169 = ZEXT1632(auVar169._0_16_);
                      auVar182 = ZEXT1664(auVar182._0_16_);
                      (*p_Var10)(&local_7b0);
                      auVar237 = ZEXT3264(_local_740);
                      auVar148 = ZEXT3264(local_6c0);
                      auVar210 = ZEXT3264(local_760);
                      auVar220 = ZEXT3264(auVar139);
                      auVar226 = ZEXT3264(auVar202);
                    }
                    auVar87._8_8_ = uStack_5d8;
                    auVar87._0_8_ = local_5e0;
                    auVar87._16_8_ = uStack_5d0;
                    auVar87._24_8_ = uStack_5c8;
                    auVar142 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar87);
                    auVar234 = vpcmpeqd_avx2(auVar169,auVar169);
                    auVar166 = auVar142 ^ auVar234;
                    auVar118 = auVar234 & ~auVar142;
                    if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar118 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar118 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar118 >> 0x7f,0) != '\0') ||
                          (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar118 >> 0xbf,0) != '\0') ||
                        (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar118[0x1f] < '\0') {
                      auVar146._0_4_ = auVar142._0_4_ ^ auVar234._0_4_;
                      auVar146._4_4_ = auVar142._4_4_ ^ auVar234._4_4_;
                      auVar146._8_4_ = auVar142._8_4_ ^ auVar234._8_4_;
                      auVar146._12_4_ = auVar142._12_4_ ^ auVar234._12_4_;
                      auVar146._16_4_ = auVar142._16_4_ ^ auVar234._16_4_;
                      auVar146._20_4_ = auVar142._20_4_ ^ auVar234._20_4_;
                      auVar146._24_4_ = auVar142._24_4_ ^ auVar234._24_4_;
                      auVar146._28_4_ = auVar142._28_4_ ^ auVar234._28_4_;
                      auVar118 = vmaskmovps_avx(auVar146,*(undefined1 (*) [32])local_7b0.hit);
                      *(undefined1 (*) [32])(local_7b0.ray + 0x180) = auVar118;
                      auVar118 = vmaskmovps_avx(auVar146,*(undefined1 (*) [32])
                                                          (local_7b0.hit + 0x20));
                      *(undefined1 (*) [32])(local_7b0.ray + 0x1a0) = auVar118;
                      auVar118 = vmaskmovps_avx(auVar146,*(undefined1 (*) [32])
                                                          (local_7b0.hit + 0x40));
                      *(undefined1 (*) [32])(local_7b0.ray + 0x1c0) = auVar118;
                      auVar118 = vmaskmovps_avx(auVar146,*(undefined1 (*) [32])
                                                          (local_7b0.hit + 0x60));
                      *(undefined1 (*) [32])(local_7b0.ray + 0x1e0) = auVar118;
                      auVar118 = vmaskmovps_avx(auVar146,*(undefined1 (*) [32])
                                                          (local_7b0.hit + 0x80));
                      *(undefined1 (*) [32])(local_7b0.ray + 0x200) = auVar118;
                      auVar118 = vpmaskmovd_avx2(auVar146,*(undefined1 (*) [32])
                                                           (local_7b0.hit + 0xa0));
                      *(undefined1 (*) [32])(local_7b0.ray + 0x220) = auVar118;
                      auVar118 = vpmaskmovd_avx2(auVar146,*(undefined1 (*) [32])
                                                           (local_7b0.hit + 0xc0));
                      *(undefined1 (*) [32])(local_7b0.ray + 0x240) = auVar118;
                      auVar118 = vpmaskmovd_avx2(auVar146,*(undefined1 (*) [32])
                                                           (local_7b0.hit + 0xe0));
                      *(undefined1 (*) [32])(local_7b0.ray + 0x260) = auVar118;
                      auVar118 = vpmaskmovd_avx2(auVar146,*(undefined1 (*) [32])
                                                           (local_7b0.hit + 0x100));
                      *(undefined1 (*) [32])(local_7b0.ray + 0x280) = auVar118;
                    }
                  }
                  auVar177 = auVar148._0_32_;
                  if ((((((((auVar166 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar166 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar166 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar166 >> 0x7f,0) == '\0') &&
                        (auVar166 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar166 >> 0xbf,0) == '\0') &&
                      (auVar166 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar166[0x1f]) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar227;
                  }
                  *(undefined4 *)(local_600 + uVar95 * 4) = 0;
                  uVar227 = *(undefined4 *)(ray + k * 4 + 0x100);
                  auVar121._4_4_ = uVar227;
                  auVar121._0_4_ = uVar227;
                  auVar121._8_4_ = uVar227;
                  auVar121._12_4_ = uVar227;
                  auVar121._16_4_ = uVar227;
                  auVar121._20_4_ = uVar227;
                  auVar121._24_4_ = uVar227;
                  auVar121._28_4_ = uVar227;
                  auVar142 = vcmpps_avx(auVar220._0_32_,auVar121,2);
                  auVar118 = vandps_avx(auVar142,local_600);
                  local_600 = local_600 & auVar142;
                  bVar79 = (local_600 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar80 = (local_600 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar78 = (local_600 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar77 = SUB321(local_600 >> 0x7f,0) != '\0';
                  bVar76 = (local_600 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar75 = SUB321(local_600 >> 0xbf,0) != '\0';
                  bVar73 = (local_600 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar72 = local_600[0x1f] < '\0';
                  if (((((((bVar79 || bVar80) || bVar78) || bVar77) || bVar76) || bVar75) || bVar73)
                      || bVar72) {
                    auVar147._8_4_ = 0x7f800000;
                    auVar147._0_8_ = 0x7f8000007f800000;
                    auVar147._12_4_ = 0x7f800000;
                    auVar147._16_4_ = 0x7f800000;
                    auVar147._20_4_ = 0x7f800000;
                    auVar147._24_4_ = 0x7f800000;
                    auVar147._28_4_ = 0x7f800000;
                    auVar142 = vblendvps_avx(auVar147,auVar220._0_32_,auVar118);
                    auVar166 = vshufps_avx(auVar142,auVar142,0xb1);
                    auVar166 = vminps_avx(auVar142,auVar166);
                    auVar234 = vshufpd_avx(auVar166,auVar166,5);
                    auVar166 = vminps_avx(auVar166,auVar234);
                    auVar234 = vpermpd_avx2(auVar166,0x4e);
                    auVar182 = ZEXT3264(auVar234);
                    auVar166 = vminps_avx(auVar166,auVar234);
                    auVar166 = vcmpps_avx(auVar142,auVar166,0);
                    auVar234 = auVar118 & auVar166;
                    auVar142 = auVar118;
                    if ((((((((auVar234 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar234 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar234 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar234 >> 0x7f,0) != '\0') ||
                          (auVar234 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar234 >> 0xbf,0) != '\0') ||
                        (auVar234 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar234[0x1f] < '\0') {
                      auVar142 = vandps_avx(auVar166,auVar118);
                    }
                    uVar94 = vmovmskps_avx(auVar142);
                    uVar98 = 0;
                    for (; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x80000000) {
                      uVar98 = uVar98 + 1;
                    }
                    uVar95 = (ulong)uVar98;
                  }
                  local_600 = auVar118;
                } while (((((((bVar79 || bVar80) || bVar78) || bVar77) || bVar76) || bVar75) ||
                         bVar73) || bVar72);
              }
            }
            auVar148 = ZEXT3264(local_660);
            fVar171 = (float)local_780;
            fVar183 = local_780._4_4_;
            fVar151 = (float)uStack_778;
            fVar123 = uStack_778._4_4_;
            fVar125 = (float)uStack_770;
            fVar243 = uStack_770._4_4_;
            fVar244 = (float)uStack_768;
            goto LAB_0164ccc4;
          }
        }
        auVar210 = ZEXT3264(local_760);
        auVar148 = ZEXT3264(local_660);
      }
LAB_0164ccc4:
      if (8 < iVar93) {
        _local_740 = auVar237._0_32_;
        local_320._4_4_ = iVar93;
        local_320._0_4_ = iVar93;
        local_320._8_4_ = iVar93;
        local_320._12_4_ = iVar93;
        local_320._16_4_ = iVar93;
        local_320._20_4_ = iVar93;
        local_320._24_4_ = iVar93;
        local_320._28_4_ = iVar93;
        local_140 = local_620._0_4_;
        uStack_13c = local_620._0_4_;
        uStack_138 = local_620._0_4_;
        uStack_134 = local_620._0_4_;
        uStack_130 = local_620._0_4_;
        uStack_12c = local_620._0_4_;
        uStack_128 = local_620._0_4_;
        uStack_124 = local_620._0_4_;
        fStack_4f0 = 1.0 / local_500;
        auStack_4fc._0_4_ = fStack_4f0;
        local_500 = fStack_4f0;
        auStack_4fc._4_4_ = fStack_4f0;
        fStack_4f4 = fStack_4f0;
        local_160 = uVar96;
        uStack_15c = uVar96;
        uStack_158 = uVar96;
        uStack_154 = uVar96;
        uStack_150 = uVar96;
        uStack_14c = uVar96;
        uStack_148 = uVar96;
        uStack_144 = uVar96;
        local_180 = uVar4;
        uStack_17c = uVar4;
        uStack_178 = uVar4;
        uStack_174 = uVar4;
        uStack_170 = uVar4;
        uStack_16c = uVar4;
        uStack_168 = uVar4;
        uStack_164 = uVar4;
        lVar99 = 8;
        auVar118 = auVar226._0_32_;
        auVar110 = auVar220._0_32_;
        fVar103 = local_720;
        fVar122 = fStack_71c;
        fVar124 = fStack_718;
        fVar126 = fStack_714;
        fVar127 = fStack_710;
        fVar128 = fStack_70c;
        fVar129 = fStack_708;
        fVar170 = fStack_704;
        local_6c0 = auVar177;
        local_5a0 = fVar152;
        fStack_59c = fVar152;
        fStack_598 = fVar152;
        fStack_594 = fVar152;
        fStack_590 = fVar152;
        fStack_58c = fVar152;
        fStack_588 = fVar152;
        fStack_584 = fVar152;
        fStack_4ec = fStack_4f0;
        fStack_4e8 = fStack_4f0;
        fStack_4e4 = fStack_4f0;
        do {
          auVar153 = local_6e0;
          auVar107 = local_6f0;
          auVar142 = *(undefined1 (*) [32])(bezier_basis0 + lVar99 * 4 + lVar20);
          auVar139 = *(undefined1 (*) [32])(lVar20 + 0x2227768 + lVar99 * 4);
          _local_620 = *(undefined1 (*) [32])(lVar20 + 0x2227bec + lVar99 * 4);
          pauVar2 = (undefined1 (*) [28])(lVar20 + 0x2228070 + lVar99 * 4);
          auVar90 = *pauVar2;
          auVar238._0_4_ = fVar103 * *(float *)*pauVar2;
          auVar238._4_4_ = fVar122 * *(float *)(*pauVar2 + 4);
          auVar238._8_4_ = fVar124 * *(float *)(*pauVar2 + 8);
          auVar238._12_4_ = fVar126 * *(float *)(*pauVar2 + 0xc);
          auVar238._16_4_ = fVar127 * *(float *)(*pauVar2 + 0x10);
          auVar238._20_4_ = fVar128 * *(float *)(*pauVar2 + 0x14);
          auVar238._28_36_ = auVar237._28_36_;
          auVar238._24_4_ = fVar129 * *(float *)(*pauVar2 + 0x18);
          auVar237._0_4_ = fVar171 * *(float *)*pauVar2;
          auVar237._4_4_ = fVar183 * *(float *)(*pauVar2 + 4);
          auVar237._8_4_ = fVar151 * *(float *)(*pauVar2 + 8);
          auVar237._12_4_ = fVar123 * *(float *)(*pauVar2 + 0xc);
          auVar237._16_4_ = fVar125 * *(float *)(*pauVar2 + 0x10);
          auVar237._20_4_ = fVar243 * *(float *)(*pauVar2 + 0x14);
          auVar237._28_36_ = auVar182._28_36_;
          auVar237._24_4_ = fVar244 * *(float *)(*pauVar2 + 0x18);
          auVar12 = vfmadd231ps_fma(auVar238._0_32_,_local_620,local_640);
          auVar15 = vfmadd231ps_fma(auVar237._0_32_,_local_620,auVar205);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar139,auVar210._0_32_);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar139,auVar148._0_32_);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar142,auVar241);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar142,local_4e0);
          auVar119 = *(undefined1 (*) [32])(bezier_basis1 + lVar99 * 4 + lVar20);
          auVar202 = *(undefined1 (*) [32])(lVar20 + 0x2229b88 + lVar99 * 4);
          auVar166 = *(undefined1 (*) [32])(lVar20 + 0x222a00c + lVar99 * 4);
          pfVar3 = (float *)(lVar20 + 0x222a490 + lVar99 * 4);
          fVar130 = *pfVar3;
          fVar150 = pfVar3[1];
          fVar221 = pfVar3[2];
          fVar222 = pfVar3[3];
          fVar223 = pfVar3[4];
          fVar224 = pfVar3[5];
          fVar81 = pfVar3[6];
          auVar42._4_4_ = fVar122 * fVar150;
          auVar42._0_4_ = fVar103 * fVar130;
          auVar42._8_4_ = fVar124 * fVar221;
          auVar42._12_4_ = fVar126 * fVar222;
          auVar42._16_4_ = fVar127 * fVar223;
          auVar42._20_4_ = fVar128 * fVar224;
          auVar42._24_4_ = fVar129 * fVar81;
          auVar42._28_4_ = fVar170;
          auVar91._4_4_ = fVar183 * fVar150;
          auVar91._0_4_ = fVar171 * fVar130;
          auVar91._8_4_ = fVar151 * fVar221;
          auVar91._12_4_ = fVar123 * fVar222;
          auVar91._16_4_ = fVar125 * fVar223;
          auVar91._20_4_ = fVar243 * fVar224;
          auVar91._24_4_ = fVar244 * fVar81;
          auVar91._28_4_ = uVar102;
          auVar16 = vfmadd231ps_fma(auVar42,auVar166,local_640);
          auVar17 = vfmadd231ps_fma(auVar91,auVar166,auVar205);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar202,auVar210._0_32_);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar202,auVar148._0_32_);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar119,auVar241);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar119,local_4e0);
          auVar231 = ZEXT1632(auVar16);
          local_300 = ZEXT1632(auVar12);
          auVar7 = vsubps_avx(auVar231,local_300);
          _local_580 = ZEXT1632(auVar17);
          auVar178 = ZEXT1632(auVar15);
          local_560 = vsubps_avx(_local_580,auVar178);
          auVar43._4_4_ = auVar15._4_4_ * auVar7._4_4_;
          auVar43._0_4_ = auVar15._0_4_ * auVar7._0_4_;
          auVar43._8_4_ = auVar15._8_4_ * auVar7._8_4_;
          auVar43._12_4_ = auVar15._12_4_ * auVar7._12_4_;
          auVar43._16_4_ = auVar7._16_4_ * 0.0;
          auVar43._20_4_ = auVar7._20_4_ * 0.0;
          auVar43._24_4_ = auVar7._24_4_ * 0.0;
          auVar43._28_4_ = local_4e0._28_4_;
          fVar152 = local_560._0_4_;
          auVar220._0_4_ = auVar12._0_4_ * fVar152;
          fVar151 = local_560._4_4_;
          auVar220._4_4_ = auVar12._4_4_ * fVar151;
          fVar123 = local_560._8_4_;
          auVar220._8_4_ = auVar12._8_4_ * fVar123;
          fVar125 = local_560._12_4_;
          auVar220._12_4_ = auVar12._12_4_ * fVar125;
          fVar243 = local_560._16_4_;
          auVar220._16_4_ = fVar243 * 0.0;
          fVar244 = local_560._20_4_;
          auVar220._20_4_ = fVar244 * 0.0;
          fVar103 = local_560._24_4_;
          auVar220._28_36_ = auVar148._28_36_;
          auVar220._24_4_ = fVar103 * 0.0;
          auVar237 = ZEXT3264(_local_620);
          auVar219 = vsubps_avx(auVar43,auVar220._0_32_);
          local_8e0 = auVar90._0_4_;
          fStack_8dc = auVar90._4_4_;
          fStack_8d8 = auVar90._8_4_;
          fStack_8d4 = auVar90._12_4_;
          fStack_8d0 = auVar90._16_4_;
          fStack_8cc = auVar90._20_4_;
          fStack_8c8 = auVar90._24_4_;
          auVar44._4_4_ = local_e0._4_4_ * fStack_8dc;
          auVar44._0_4_ = (float)local_e0 * local_8e0;
          auVar44._8_4_ = (float)uStack_d8 * fStack_8d8;
          auVar44._12_4_ = uStack_d8._4_4_ * fStack_8d4;
          auVar44._16_4_ = (float)uStack_d0 * fStack_8d0;
          auVar44._20_4_ = uStack_d0._4_4_ * fStack_8cc;
          auVar44._24_4_ = (float)uStack_c8 * fStack_8c8;
          auVar44._28_4_ = local_640._28_4_;
          auVar12 = vfmadd231ps_fma(auVar44,_local_620,local_c0);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar139,local_a0);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),local_80,auVar142);
          auVar45._4_4_ = local_e0._4_4_ * fVar150;
          auVar45._0_4_ = (float)local_e0 * fVar130;
          auVar45._8_4_ = (float)uStack_d8 * fVar221;
          auVar45._12_4_ = uStack_d8._4_4_ * fVar222;
          auVar45._16_4_ = (float)uStack_d0 * fVar223;
          auVar45._20_4_ = uStack_d0._4_4_ * fVar224;
          auVar45._24_4_ = (float)uStack_c8 * fVar81;
          auVar45._28_4_ = uStack_c8._4_4_;
          auVar17 = vfmadd231ps_fma(auVar45,auVar166,local_c0);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar202,local_a0);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar119,local_80);
          auVar46._4_4_ = fVar151 * fVar151;
          auVar46._0_4_ = fVar152 * fVar152;
          auVar46._8_4_ = fVar123 * fVar123;
          auVar46._12_4_ = fVar125 * fVar125;
          auVar46._16_4_ = fVar243 * fVar243;
          auVar46._20_4_ = fVar244 * fVar244;
          auVar46._24_4_ = fVar103 * fVar103;
          auVar46._28_4_ = local_80._28_4_;
          auVar108 = vfmadd231ps_fma(auVar46,auVar7,auVar7);
          auVar234 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar17));
          auVar216._0_4_ = auVar234._0_4_ * auVar234._0_4_ * auVar108._0_4_;
          auVar216._4_4_ = auVar234._4_4_ * auVar234._4_4_ * auVar108._4_4_;
          auVar216._8_4_ = auVar234._8_4_ * auVar234._8_4_ * auVar108._8_4_;
          auVar216._12_4_ = auVar234._12_4_ * auVar234._12_4_ * auVar108._12_4_;
          auVar216._16_4_ = auVar234._16_4_ * auVar234._16_4_ * 0.0;
          auVar216._20_4_ = auVar234._20_4_ * auVar234._20_4_ * 0.0;
          auVar216._24_4_ = auVar234._24_4_ * auVar234._24_4_ * 0.0;
          auVar216._28_4_ = 0;
          auVar47._4_4_ = auVar219._4_4_ * auVar219._4_4_;
          auVar47._0_4_ = auVar219._0_4_ * auVar219._0_4_;
          auVar47._8_4_ = auVar219._8_4_ * auVar219._8_4_;
          auVar47._12_4_ = auVar219._12_4_ * auVar219._12_4_;
          auVar47._16_4_ = auVar219._16_4_ * auVar219._16_4_;
          auVar47._20_4_ = auVar219._20_4_ * auVar219._20_4_;
          auVar47._24_4_ = auVar219._24_4_ * auVar219._24_4_;
          auVar47._28_4_ = auVar219._28_4_;
          auVar234 = vcmpps_avx(auVar47,auVar216,2);
          auVar182 = ZEXT3264(auVar234);
          local_460 = (int)lVar99;
          auVar217._4_4_ = local_460;
          auVar217._0_4_ = local_460;
          auVar217._8_4_ = local_460;
          auVar217._12_4_ = local_460;
          auVar217._16_4_ = local_460;
          auVar217._20_4_ = local_460;
          auVar217._24_4_ = local_460;
          auVar217._28_4_ = local_460;
          auVar219 = vpor_avx2(auVar217,_DAT_0205a920);
          auVar112 = vpcmpgtd_avx2(local_320,auVar219);
          auVar219 = auVar112 & auVar234;
          fVar103 = local_720;
          fVar122 = fStack_71c;
          fVar124 = fStack_718;
          fVar126 = fStack_714;
          fVar127 = fStack_710;
          fVar128 = fStack_70c;
          fVar129 = fStack_708;
          fVar170 = fStack_704;
          fVar171 = (float)local_780;
          fVar183 = local_780._4_4_;
          fVar151 = (float)uStack_778;
          fVar123 = uStack_778._4_4_;
          fVar125 = (float)uStack_770;
          fVar243 = uStack_770._4_4_;
          fVar244 = (float)uStack_768;
          if ((((((((auVar219 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar219 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar219 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar219 >> 0x7f,0) == '\0') &&
                (auVar219 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar219 >> 0xbf,0) == '\0') &&
              (auVar219 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar219[0x1f]) {
LAB_0164d86e:
            auVar148 = ZEXT3264(local_660);
            auVar210 = ZEXT3264(local_760);
          }
          else {
            local_340 = vandps_avx(auVar112,auVar234);
            auVar48._4_4_ = (float)local_740._4_4_ * fVar150;
            auVar48._0_4_ = (float)local_740._0_4_ * fVar130;
            auVar48._8_4_ = fStack_738 * fVar221;
            auVar48._12_4_ = fStack_734 * fVar222;
            auVar48._16_4_ = fStack_730 * fVar223;
            auVar48._20_4_ = fStack_72c * fVar224;
            auVar48._24_4_ = fStack_728 * fVar81;
            auVar48._28_4_ = auVar234._28_4_;
            auVar108 = vfmadd213ps_fma(auVar166,local_540,auVar48);
            auVar108 = vfmadd213ps_fma(auVar202,local_100,ZEXT1632(auVar108));
            auVar108 = vfmadd132ps_fma(auVar119,ZEXT1632(auVar108),local_6c0);
            auVar49._4_4_ = (float)local_740._4_4_ * fStack_8dc;
            auVar49._0_4_ = (float)local_740._0_4_ * local_8e0;
            auVar49._8_4_ = fStack_738 * fStack_8d8;
            auVar49._12_4_ = fStack_734 * fStack_8d4;
            auVar49._16_4_ = fStack_730 * fStack_8d0;
            auVar49._20_4_ = fStack_72c * fStack_8cc;
            auVar49._24_4_ = fStack_728 * fStack_8c8;
            auVar49._28_4_ = auVar234._28_4_;
            auVar132 = vfmadd213ps_fma(_local_620,local_540,auVar49);
            auVar132 = vfmadd213ps_fma(auVar139,local_100,ZEXT1632(auVar132));
            auVar139 = *(undefined1 (*) [32])(lVar20 + 0x22284f4 + lVar99 * 4);
            auVar202 = *(undefined1 (*) [32])(lVar20 + 0x2228978 + lVar99 * 4);
            auVar166 = *(undefined1 (*) [32])(lVar20 + 0x2228dfc + lVar99 * 4);
            pfVar3 = (float *)(lVar20 + 0x2229280 + lVar99 * 4);
            fVar152 = *pfVar3;
            fVar130 = pfVar3[1];
            fVar150 = pfVar3[2];
            fVar221 = pfVar3[3];
            fVar222 = pfVar3[4];
            fVar223 = pfVar3[5];
            fVar224 = pfVar3[6];
            auVar213._0_4_ = local_720 * fVar152;
            auVar213._4_4_ = fStack_71c * fVar130;
            auVar213._8_4_ = fStack_718 * fVar150;
            auVar213._12_4_ = fStack_714 * fVar221;
            auVar213._16_4_ = fStack_710 * fVar222;
            auVar213._20_4_ = fStack_70c * fVar223;
            auVar213._24_4_ = fStack_708 * fVar224;
            auVar213._28_4_ = 0;
            auVar235._0_4_ = (float)local_780 * fVar152;
            auVar235._4_4_ = local_780._4_4_ * fVar130;
            auVar235._8_4_ = (float)uStack_778 * fVar150;
            auVar235._12_4_ = uStack_778._4_4_ * fVar221;
            auVar235._16_4_ = (float)uStack_770 * fVar222;
            auVar235._20_4_ = uStack_770._4_4_ * fVar223;
            auVar235._24_4_ = (float)uStack_768 * fVar224;
            auVar235._28_4_ = 0;
            auVar50._4_4_ = fVar130 * (float)local_740._4_4_;
            auVar50._0_4_ = fVar152 * (float)local_740._0_4_;
            auVar50._8_4_ = fVar150 * fStack_738;
            auVar50._12_4_ = fVar221 * fStack_734;
            auVar50._16_4_ = fVar222 * fStack_730;
            auVar50._20_4_ = fVar223 * fStack_72c;
            auVar50._24_4_ = fVar224 * fStack_728;
            auVar50._28_4_ = pfVar3[7];
            auVar106 = vfmadd231ps_fma(auVar213,auVar166,local_640);
            auVar133 = vfmadd231ps_fma(auVar235,auVar166,auVar205);
            auVar172 = vfmadd231ps_fma(auVar50,local_540,auVar166);
            auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar202,local_760);
            auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar202,local_660);
            auVar172 = vfmadd231ps_fma(ZEXT1632(auVar172),local_100,auVar202);
            auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar139,auVar241);
            auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar139,local_4e0);
            auVar172 = vfmadd231ps_fma(ZEXT1632(auVar172),auVar139,local_6c0);
            pfVar3 = (float *)(lVar20 + 0x222b6a0 + lVar99 * 4);
            fVar152 = *pfVar3;
            fVar130 = pfVar3[1];
            fVar150 = pfVar3[2];
            fVar221 = pfVar3[3];
            fVar222 = pfVar3[4];
            fVar223 = pfVar3[5];
            fVar224 = pfVar3[6];
            auVar51._4_4_ = fStack_71c * fVar130;
            auVar51._0_4_ = local_720 * fVar152;
            auVar51._8_4_ = fStack_718 * fVar150;
            auVar51._12_4_ = fStack_714 * fVar221;
            auVar51._16_4_ = fStack_710 * fVar222;
            auVar51._20_4_ = fStack_70c * fVar223;
            auVar51._24_4_ = fStack_708 * fVar224;
            auVar51._28_4_ = fStack_704;
            auVar52._4_4_ = local_780._4_4_ * fVar130;
            auVar52._0_4_ = (float)local_780 * fVar152;
            auVar52._8_4_ = (float)uStack_778 * fVar150;
            auVar52._12_4_ = uStack_778._4_4_ * fVar221;
            auVar52._16_4_ = (float)uStack_770 * fVar222;
            auVar52._20_4_ = uStack_770._4_4_ * fVar223;
            auVar52._24_4_ = (float)uStack_768 * fVar224;
            auVar52._28_4_ = uStack_768._4_4_;
            auVar53._4_4_ = fVar130 * (float)local_740._4_4_;
            auVar53._0_4_ = fVar152 * (float)local_740._0_4_;
            auVar53._8_4_ = fVar150 * fStack_738;
            auVar53._12_4_ = fVar221 * fStack_734;
            auVar53._16_4_ = fVar222 * fStack_730;
            auVar53._20_4_ = fVar223 * fStack_72c;
            auVar53._24_4_ = fVar224 * fStack_728;
            auVar53._28_4_ = pfVar3[7];
            auVar139 = *(undefined1 (*) [32])(lVar20 + 0x222b21c + lVar99 * 4);
            auVar185 = vfmadd231ps_fma(auVar51,auVar139,local_640);
            auVar105 = vfmadd231ps_fma(auVar52,auVar139,auVar205);
            auVar131 = vfmadd231ps_fma(auVar53,local_540,auVar139);
            auVar139 = *(undefined1 (*) [32])(lVar20 + 0x222ad98 + lVar99 * 4);
            auVar185 = vfmadd231ps_fma(ZEXT1632(auVar185),auVar139,local_760);
            auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar139,local_660);
            auVar131 = vfmadd231ps_fma(ZEXT1632(auVar131),local_100,auVar139);
            auVar139 = *(undefined1 (*) [32])(lVar20 + 0x222a914 + lVar99 * 4);
            auVar185 = vfmadd231ps_fma(ZEXT1632(auVar185),auVar139,auVar241);
            auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar139,local_4e0);
            auVar131 = vfmadd231ps_fma(ZEXT1632(auVar131),local_6c0,auVar139);
            auVar218._8_4_ = 0x7fffffff;
            auVar218._0_8_ = 0x7fffffff7fffffff;
            auVar218._12_4_ = 0x7fffffff;
            auVar218._16_4_ = 0x7fffffff;
            auVar218._20_4_ = 0x7fffffff;
            auVar218._24_4_ = 0x7fffffff;
            auVar218._28_4_ = 0x7fffffff;
            auVar139 = vandps_avx(ZEXT1632(auVar106),auVar218);
            auVar202 = vandps_avx(ZEXT1632(auVar133),auVar218);
            auVar202 = vmaxps_avx(auVar139,auVar202);
            auVar139 = vandps_avx(ZEXT1632(auVar172),auVar218);
            auVar139 = vmaxps_avx(auVar202,auVar139);
            auVar88._4_4_ = fStack_59c;
            auVar88._0_4_ = local_5a0;
            auVar88._8_4_ = fStack_598;
            auVar88._12_4_ = fStack_594;
            auVar88._16_4_ = fStack_590;
            auVar88._20_4_ = fStack_58c;
            auVar88._24_4_ = fStack_588;
            auVar88._28_4_ = fStack_584;
            auVar139 = vcmpps_avx(auVar139,auVar88,1);
            auVar166 = vblendvps_avx(ZEXT1632(auVar106),auVar7,auVar139);
            auVar234 = vblendvps_avx(ZEXT1632(auVar133),local_560,auVar139);
            auVar139 = vandps_avx(ZEXT1632(auVar185),auVar218);
            auVar202 = vandps_avx(ZEXT1632(auVar105),auVar218);
            auVar202 = vmaxps_avx(auVar139,auVar202);
            auVar139 = vandps_avx(auVar218,ZEXT1632(auVar131));
            auVar139 = vmaxps_avx(auVar202,auVar139);
            auVar202 = vcmpps_avx(auVar139,auVar88,1);
            auVar139 = vblendvps_avx(ZEXT1632(auVar185),auVar7,auVar202);
            auVar202 = vblendvps_avx(ZEXT1632(auVar105),local_560,auVar202);
            auVar132 = vfmadd213ps_fma(auVar142,local_6c0,ZEXT1632(auVar132));
            auVar106 = vfmadd213ps_fma(auVar166,auVar166,ZEXT832(0) << 0x20);
            auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar234,auVar234);
            auVar142 = vrsqrtps_avx(ZEXT1632(auVar106));
            fVar152 = auVar142._0_4_;
            fVar130 = auVar142._4_4_;
            fVar150 = auVar142._8_4_;
            fVar221 = auVar142._12_4_;
            fVar222 = auVar142._16_4_;
            fVar223 = auVar142._20_4_;
            fVar224 = auVar142._24_4_;
            auVar54._4_4_ = fVar130 * fVar130 * fVar130 * auVar106._4_4_ * -0.5;
            auVar54._0_4_ = fVar152 * fVar152 * fVar152 * auVar106._0_4_ * -0.5;
            auVar54._8_4_ = fVar150 * fVar150 * fVar150 * auVar106._8_4_ * -0.5;
            auVar54._12_4_ = fVar221 * fVar221 * fVar221 * auVar106._12_4_ * -0.5;
            auVar54._16_4_ = fVar222 * fVar222 * fVar222 * -0.0;
            auVar54._20_4_ = fVar223 * fVar223 * fVar223 * -0.0;
            auVar54._24_4_ = fVar224 * fVar224 * fVar224 * -0.0;
            auVar54._28_4_ = 0;
            auVar242._8_4_ = 0x3fc00000;
            auVar242._0_8_ = 0x3fc000003fc00000;
            auVar242._12_4_ = 0x3fc00000;
            auVar242._16_4_ = 0x3fc00000;
            auVar242._20_4_ = 0x3fc00000;
            auVar242._24_4_ = 0x3fc00000;
            auVar242._28_4_ = 0x3fc00000;
            auVar106 = vfmadd231ps_fma(auVar54,auVar242,auVar142);
            fVar152 = auVar106._0_4_;
            fVar130 = auVar106._4_4_;
            auVar55._4_4_ = auVar234._4_4_ * fVar130;
            auVar55._0_4_ = auVar234._0_4_ * fVar152;
            fVar150 = auVar106._8_4_;
            auVar55._8_4_ = auVar234._8_4_ * fVar150;
            fVar221 = auVar106._12_4_;
            auVar55._12_4_ = auVar234._12_4_ * fVar221;
            auVar55._16_4_ = auVar234._16_4_ * 0.0;
            auVar55._20_4_ = auVar234._20_4_ * 0.0;
            auVar55._24_4_ = auVar234._24_4_ * 0.0;
            auVar55._28_4_ = auVar142._28_4_;
            auVar56._4_4_ = fVar130 * -auVar166._4_4_;
            auVar56._0_4_ = fVar152 * -auVar166._0_4_;
            auVar56._8_4_ = fVar150 * -auVar166._8_4_;
            auVar56._12_4_ = fVar221 * -auVar166._12_4_;
            auVar56._16_4_ = -auVar166._16_4_ * 0.0;
            auVar56._20_4_ = -auVar166._20_4_ * 0.0;
            auVar56._24_4_ = -auVar166._24_4_ * 0.0;
            auVar56._28_4_ = auVar234._28_4_;
            auVar106 = vfmadd213ps_fma(auVar139,auVar139,ZEXT832(0) << 0x20);
            auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar202,auVar202);
            auVar142 = vrsqrtps_avx(ZEXT1632(auVar106));
            auVar57._28_4_ = local_760._28_4_;
            auVar57._0_28_ =
                 ZEXT1628(CONCAT412(fVar221 * 0.0,
                                    CONCAT48(fVar150 * 0.0,CONCAT44(fVar130 * 0.0,fVar152 * 0.0))));
            fVar152 = auVar142._0_4_;
            fVar130 = auVar142._4_4_;
            fVar150 = auVar142._8_4_;
            fVar221 = auVar142._12_4_;
            fVar222 = auVar142._16_4_;
            fVar223 = auVar142._20_4_;
            fVar224 = auVar142._24_4_;
            auVar58._4_4_ = fVar130 * fVar130 * fVar130 * auVar106._4_4_ * -0.5;
            auVar58._0_4_ = fVar152 * fVar152 * fVar152 * auVar106._0_4_ * -0.5;
            auVar58._8_4_ = fVar150 * fVar150 * fVar150 * auVar106._8_4_ * -0.5;
            auVar58._12_4_ = fVar221 * fVar221 * fVar221 * auVar106._12_4_ * -0.5;
            auVar58._16_4_ = fVar222 * fVar222 * fVar222 * -0.0;
            auVar58._20_4_ = fVar223 * fVar223 * fVar223 * -0.0;
            auVar58._24_4_ = fVar224 * fVar224 * fVar224 * -0.0;
            auVar58._28_4_ = 0;
            auVar106 = vfmadd231ps_fma(auVar58,auVar242,auVar142);
            fVar152 = auVar106._0_4_;
            fVar130 = auVar106._4_4_;
            auVar59._4_4_ = auVar202._4_4_ * fVar130;
            auVar59._0_4_ = auVar202._0_4_ * fVar152;
            fVar150 = auVar106._8_4_;
            auVar59._8_4_ = auVar202._8_4_ * fVar150;
            fVar221 = auVar106._12_4_;
            auVar59._12_4_ = auVar202._12_4_ * fVar221;
            auVar59._16_4_ = auVar202._16_4_ * 0.0;
            auVar59._20_4_ = auVar202._20_4_ * 0.0;
            auVar59._24_4_ = auVar202._24_4_ * 0.0;
            auVar59._28_4_ = 0;
            auVar60._4_4_ = fVar130 * -auVar139._4_4_;
            auVar60._0_4_ = fVar152 * -auVar139._0_4_;
            auVar60._8_4_ = fVar150 * -auVar139._8_4_;
            auVar60._12_4_ = fVar221 * -auVar139._12_4_;
            auVar60._16_4_ = -auVar139._16_4_ * 0.0;
            auVar60._20_4_ = -auVar139._20_4_ * 0.0;
            auVar60._24_4_ = -auVar139._24_4_ * 0.0;
            auVar60._28_4_ = auVar142._28_4_;
            auVar61._28_4_ = 0xbf000000;
            auVar61._0_28_ =
                 ZEXT1628(CONCAT412(fVar221 * 0.0,
                                    CONCAT48(fVar150 * 0.0,CONCAT44(fVar130 * 0.0,fVar152 * 0.0))));
            auVar106 = vfmadd213ps_fma(auVar55,ZEXT1632(auVar12),local_300);
            auVar142 = ZEXT1632(auVar12);
            auVar133 = vfmadd213ps_fma(auVar56,auVar142,auVar178);
            auVar172 = vfmadd213ps_fma(auVar57,auVar142,ZEXT1632(auVar132));
            auVar131 = vfnmadd213ps_fma(auVar55,auVar142,local_300);
            auVar185 = vfmadd213ps_fma(auVar59,ZEXT1632(auVar17),auVar231);
            auVar184 = vfnmadd213ps_fma(auVar56,auVar142,auVar178);
            auVar142 = ZEXT1632(auVar17);
            auVar105 = vfmadd213ps_fma(auVar60,auVar142,_local_580);
            auVar113 = ZEXT1632(auVar12);
            auVar12 = vfnmadd231ps_fma(ZEXT1632(auVar132),auVar113,auVar57);
            auVar132 = vfmadd213ps_fma(auVar61,auVar142,ZEXT1632(auVar108));
            auVar191 = vfnmadd213ps_fma(auVar59,auVar142,auVar231);
            auVar192 = vfnmadd213ps_fma(auVar60,auVar142,_local_580);
            auVar193 = vfnmadd231ps_fma(ZEXT1632(auVar108),ZEXT1632(auVar17),auVar61);
            auVar142 = vsubps_avx(ZEXT1632(auVar105),ZEXT1632(auVar184));
            auVar139 = vsubps_avx(ZEXT1632(auVar132),ZEXT1632(auVar12));
            auVar62._4_4_ = auVar142._4_4_ * auVar12._4_4_;
            auVar62._0_4_ = auVar142._0_4_ * auVar12._0_4_;
            auVar62._8_4_ = auVar142._8_4_ * auVar12._8_4_;
            auVar62._12_4_ = auVar142._12_4_ * auVar12._12_4_;
            auVar62._16_4_ = auVar142._16_4_ * 0.0;
            auVar62._20_4_ = auVar142._20_4_ * 0.0;
            auVar62._24_4_ = auVar142._24_4_ * 0.0;
            auVar62._28_4_ = local_760._28_4_;
            auVar108 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar184),auVar139);
            auVar63._4_4_ = auVar131._4_4_ * auVar139._4_4_;
            auVar63._0_4_ = auVar131._0_4_ * auVar139._0_4_;
            auVar63._8_4_ = auVar131._8_4_ * auVar139._8_4_;
            auVar63._12_4_ = auVar131._12_4_ * auVar139._12_4_;
            auVar63._16_4_ = auVar139._16_4_ * 0.0;
            auVar63._20_4_ = auVar139._20_4_ * 0.0;
            auVar63._24_4_ = auVar139._24_4_ * 0.0;
            auVar63._28_4_ = auVar139._28_4_;
            auVar219 = ZEXT1632(auVar131);
            auVar139 = vsubps_avx(ZEXT1632(auVar185),auVar219);
            auVar119 = ZEXT1632(auVar12);
            auVar12 = vfmsub231ps_fma(auVar63,auVar119,auVar139);
            auVar64._4_4_ = auVar184._4_4_ * auVar139._4_4_;
            auVar64._0_4_ = auVar184._0_4_ * auVar139._0_4_;
            auVar64._8_4_ = auVar184._8_4_ * auVar139._8_4_;
            auVar64._12_4_ = auVar184._12_4_ * auVar139._12_4_;
            auVar64._16_4_ = auVar139._16_4_ * 0.0;
            auVar64._20_4_ = auVar139._20_4_ * 0.0;
            auVar64._24_4_ = auVar139._24_4_ * 0.0;
            auVar64._28_4_ = auVar139._28_4_;
            auVar131 = vfmsub231ps_fma(auVar64,auVar219,auVar142);
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar131),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar108));
            auVar178 = vcmpps_avx(ZEXT1632(auVar12),ZEXT832(0) << 0x20,2);
            auVar142 = vblendvps_avx(ZEXT1632(auVar191),ZEXT1632(auVar106),auVar178);
            auVar139 = vblendvps_avx(ZEXT1632(auVar192),ZEXT1632(auVar133),auVar178);
            auVar202 = vblendvps_avx(ZEXT1632(auVar193),ZEXT1632(auVar172),auVar178);
            auVar166 = vblendvps_avx(auVar219,ZEXT1632(auVar185),auVar178);
            auVar234 = vblendvps_avx(ZEXT1632(auVar184),ZEXT1632(auVar105),auVar178);
            auVar7 = vblendvps_avx(auVar119,ZEXT1632(auVar132),auVar178);
            auVar219 = vblendvps_avx(ZEXT1632(auVar185),auVar219,auVar178);
            auVar112 = vblendvps_avx(ZEXT1632(auVar105),ZEXT1632(auVar184),auVar178);
            auVar12 = vpackssdw_avx(local_340._0_16_,local_340._16_16_);
            auVar119 = vblendvps_avx(ZEXT1632(auVar132),auVar119,auVar178);
            auVar219 = vsubps_avx(auVar219,auVar142);
            auVar112 = vsubps_avx(auVar112,auVar139);
            auVar231 = vsubps_avx(auVar119,auVar202);
            auVar237 = ZEXT3264(auVar231);
            auVar18 = vsubps_avx(auVar142,auVar166);
            auVar19 = vsubps_avx(auVar139,auVar234);
            auVar111 = vsubps_avx(auVar202,auVar7);
            auVar199._0_4_ = auVar231._0_4_ * auVar142._0_4_;
            auVar199._4_4_ = auVar231._4_4_ * auVar142._4_4_;
            auVar199._8_4_ = auVar231._8_4_ * auVar142._8_4_;
            auVar199._12_4_ = auVar231._12_4_ * auVar142._12_4_;
            auVar199._16_4_ = auVar231._16_4_ * auVar142._16_4_;
            auVar199._20_4_ = auVar231._20_4_ * auVar142._20_4_;
            auVar199._24_4_ = auVar231._24_4_ * auVar142._24_4_;
            auVar199._28_4_ = 0;
            auVar108 = vfmsub231ps_fma(auVar199,auVar202,auVar219);
            auVar65._4_4_ = auVar219._4_4_ * auVar139._4_4_;
            auVar65._0_4_ = auVar219._0_4_ * auVar139._0_4_;
            auVar65._8_4_ = auVar219._8_4_ * auVar139._8_4_;
            auVar65._12_4_ = auVar219._12_4_ * auVar139._12_4_;
            auVar65._16_4_ = auVar219._16_4_ * auVar139._16_4_;
            auVar65._20_4_ = auVar219._20_4_ * auVar139._20_4_;
            auVar65._24_4_ = auVar219._24_4_ * auVar139._24_4_;
            auVar65._28_4_ = auVar119._28_4_;
            auVar132 = vfmsub231ps_fma(auVar65,auVar142,auVar112);
            auVar108 = vfmadd231ps_fma(ZEXT1632(auVar132),ZEXT1632(auVar108),_DAT_02020f00);
            auVar200._0_4_ = auVar112._0_4_ * auVar202._0_4_;
            auVar200._4_4_ = auVar112._4_4_ * auVar202._4_4_;
            auVar200._8_4_ = auVar112._8_4_ * auVar202._8_4_;
            auVar200._12_4_ = auVar112._12_4_ * auVar202._12_4_;
            auVar200._16_4_ = auVar112._16_4_ * auVar202._16_4_;
            auVar200._20_4_ = auVar112._20_4_ * auVar202._20_4_;
            auVar200._24_4_ = auVar112._24_4_ * auVar202._24_4_;
            auVar200._28_4_ = 0;
            auVar132 = vfmsub231ps_fma(auVar200,auVar139,auVar231);
            auVar132 = vfmadd231ps_fma(ZEXT1632(auVar108),ZEXT832(0) << 0x20,ZEXT1632(auVar132));
            auVar201._0_4_ = auVar111._0_4_ * auVar166._0_4_;
            auVar201._4_4_ = auVar111._4_4_ * auVar166._4_4_;
            auVar201._8_4_ = auVar111._8_4_ * auVar166._8_4_;
            auVar201._12_4_ = auVar111._12_4_ * auVar166._12_4_;
            auVar201._16_4_ = auVar111._16_4_ * auVar166._16_4_;
            auVar201._20_4_ = auVar111._20_4_ * auVar166._20_4_;
            auVar201._24_4_ = auVar111._24_4_ * auVar166._24_4_;
            auVar201._28_4_ = 0;
            auVar108 = vfmsub231ps_fma(auVar201,auVar18,auVar7);
            auVar66._4_4_ = auVar19._4_4_ * auVar7._4_4_;
            auVar66._0_4_ = auVar19._0_4_ * auVar7._0_4_;
            auVar66._8_4_ = auVar19._8_4_ * auVar7._8_4_;
            auVar66._12_4_ = auVar19._12_4_ * auVar7._12_4_;
            auVar66._16_4_ = auVar19._16_4_ * auVar7._16_4_;
            auVar66._20_4_ = auVar19._20_4_ * auVar7._20_4_;
            auVar66._24_4_ = auVar19._24_4_ * auVar7._24_4_;
            auVar66._28_4_ = auVar7._28_4_;
            auVar106 = vfmsub231ps_fma(auVar66,auVar234,auVar111);
            auVar67._4_4_ = auVar18._4_4_ * auVar234._4_4_;
            auVar67._0_4_ = auVar18._0_4_ * auVar234._0_4_;
            auVar67._8_4_ = auVar18._8_4_ * auVar234._8_4_;
            auVar67._12_4_ = auVar18._12_4_ * auVar234._12_4_;
            auVar67._16_4_ = auVar18._16_4_ * auVar234._16_4_;
            auVar67._20_4_ = auVar18._20_4_ * auVar234._20_4_;
            auVar67._24_4_ = auVar18._24_4_ * auVar234._24_4_;
            auVar67._28_4_ = auVar234._28_4_;
            auVar133 = vfmsub231ps_fma(auVar67,auVar19,auVar166);
            auVar108 = vfmadd231ps_fma(ZEXT1632(auVar133),ZEXT832(0) << 0x20,ZEXT1632(auVar108));
            auVar106 = vfmadd231ps_fma(ZEXT1632(auVar108),ZEXT832(0) << 0x20,ZEXT1632(auVar106));
            auVar166 = vmaxps_avx(ZEXT1632(auVar132),ZEXT1632(auVar106));
            auVar166 = vcmpps_avx(auVar166,ZEXT832(0) << 0x20,2);
            auVar108 = vpackssdw_avx(auVar166._0_16_,auVar166._16_16_);
            auVar108 = vpand_avx(auVar108,auVar12);
            auVar166 = vpmovsxwd_avx2(auVar108);
            if ((((((((auVar166 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar166 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar166 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar166 >> 0x7f,0) == '\0') &&
                  (auVar166 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar166 >> 0xbf,0) == '\0') &&
                (auVar166 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar166[0x1f]) {
LAB_0164dbd8:
              auVar182 = ZEXT3264(CONCAT824(uStack_5a8,
                                            CONCAT816(uStack_5b0,CONCAT88(uStack_5b8,local_5c0))));
            }
            else {
              auVar68._4_4_ = auVar112._4_4_ * auVar111._4_4_;
              auVar68._0_4_ = auVar112._0_4_ * auVar111._0_4_;
              auVar68._8_4_ = auVar112._8_4_ * auVar111._8_4_;
              auVar68._12_4_ = auVar112._12_4_ * auVar111._12_4_;
              auVar68._16_4_ = auVar112._16_4_ * auVar111._16_4_;
              auVar68._20_4_ = auVar112._20_4_ * auVar111._20_4_;
              auVar68._24_4_ = auVar112._24_4_ * auVar111._24_4_;
              auVar68._28_4_ = auVar166._28_4_;
              auVar105 = vfmsub231ps_fma(auVar68,auVar19,auVar231);
              auVar206._0_4_ = auVar231._0_4_ * auVar18._0_4_;
              auVar206._4_4_ = auVar231._4_4_ * auVar18._4_4_;
              auVar206._8_4_ = auVar231._8_4_ * auVar18._8_4_;
              auVar206._12_4_ = auVar231._12_4_ * auVar18._12_4_;
              auVar206._16_4_ = auVar231._16_4_ * auVar18._16_4_;
              auVar206._20_4_ = auVar231._20_4_ * auVar18._20_4_;
              auVar206._24_4_ = auVar231._24_4_ * auVar18._24_4_;
              auVar206._28_4_ = 0;
              auVar185 = vfmsub231ps_fma(auVar206,auVar219,auVar111);
              auVar69._4_4_ = auVar219._4_4_ * auVar19._4_4_;
              auVar69._0_4_ = auVar219._0_4_ * auVar19._0_4_;
              auVar69._8_4_ = auVar219._8_4_ * auVar19._8_4_;
              auVar69._12_4_ = auVar219._12_4_ * auVar19._12_4_;
              auVar69._16_4_ = auVar219._16_4_ * auVar19._16_4_;
              auVar69._20_4_ = auVar219._20_4_ * auVar19._20_4_;
              auVar69._24_4_ = auVar219._24_4_ * auVar19._24_4_;
              auVar69._28_4_ = auVar19._28_4_;
              auVar131 = vfmsub231ps_fma(auVar69,auVar18,auVar112);
              auVar133 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar185),ZEXT1632(auVar131));
              auVar172 = vfmadd231ps_fma(ZEXT1632(auVar133),ZEXT1632(auVar105),ZEXT832(0) << 0x20);
              auVar166 = vrcpps_avx(ZEXT1632(auVar172));
              auVar236._8_4_ = 0x3f800000;
              auVar236._0_8_ = &DAT_3f8000003f800000;
              auVar236._12_4_ = 0x3f800000;
              auVar236._16_4_ = 0x3f800000;
              auVar236._20_4_ = 0x3f800000;
              auVar236._24_4_ = 0x3f800000;
              auVar236._28_4_ = 0x3f800000;
              auVar237 = ZEXT3264(auVar236);
              auVar133 = vfnmadd213ps_fma(auVar166,ZEXT1632(auVar172),auVar236);
              auVar133 = vfmadd132ps_fma(ZEXT1632(auVar133),auVar166,auVar166);
              auVar179._0_4_ = auVar131._0_4_ * auVar202._0_4_;
              auVar179._4_4_ = auVar131._4_4_ * auVar202._4_4_;
              auVar179._8_4_ = auVar131._8_4_ * auVar202._8_4_;
              auVar179._12_4_ = auVar131._12_4_ * auVar202._12_4_;
              auVar179._16_4_ = auVar202._16_4_ * 0.0;
              auVar179._20_4_ = auVar202._20_4_ * 0.0;
              auVar179._24_4_ = auVar202._24_4_ * 0.0;
              auVar179._28_4_ = 0;
              auVar185 = vfmadd231ps_fma(auVar179,ZEXT1632(auVar185),auVar139);
              auVar185 = vfmadd231ps_fma(ZEXT1632(auVar185),auVar142,ZEXT1632(auVar105));
              fVar152 = auVar133._0_4_;
              fVar130 = auVar133._4_4_;
              fVar150 = auVar133._8_4_;
              fVar221 = auVar133._12_4_;
              auVar202 = ZEXT1632(CONCAT412(fVar221 * auVar185._12_4_,
                                            CONCAT48(fVar150 * auVar185._8_4_,
                                                     CONCAT44(fVar130 * auVar185._4_4_,
                                                              fVar152 * auVar185._0_4_))));
              uVar227 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar180._4_4_ = uVar227;
              auVar180._0_4_ = uVar227;
              auVar180._8_4_ = uVar227;
              auVar180._12_4_ = uVar227;
              auVar180._16_4_ = uVar227;
              auVar180._20_4_ = uVar227;
              auVar180._24_4_ = uVar227;
              auVar180._28_4_ = uVar227;
              auVar89._4_4_ = uStack_13c;
              auVar89._0_4_ = local_140;
              auVar89._8_4_ = uStack_138;
              auVar89._12_4_ = uStack_134;
              auVar89._16_4_ = uStack_130;
              auVar89._20_4_ = uStack_12c;
              auVar89._24_4_ = uStack_128;
              auVar89._28_4_ = uStack_124;
              auVar142 = vcmpps_avx(auVar89,auVar202,2);
              auVar139 = vcmpps_avx(auVar202,auVar180,2);
              auVar142 = vandps_avx(auVar139,auVar142);
              auVar133 = vpackssdw_avx(auVar142._0_16_,auVar142._16_16_);
              auVar108 = vpand_avx(auVar108,auVar133);
              auVar142 = vpmovsxwd_avx2(auVar108);
              if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar142 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar142 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar142 >> 0x7f,0) == '\0') &&
                    (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar142 >> 0xbf,0) == '\0') &&
                  (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar142[0x1f]) goto LAB_0164dbd8;
              auVar142 = vcmpps_avx(ZEXT1632(auVar172),ZEXT832(0) << 0x20,4);
              auVar133 = vpackssdw_avx(auVar142._0_16_,auVar142._16_16_);
              auVar108 = vpand_avx(auVar108,auVar133);
              auVar142 = vpmovsxwd_avx2(auVar108);
              auVar182 = ZEXT3264(CONCAT824(uStack_5a8,
                                            CONCAT816(uStack_5b0,CONCAT88(uStack_5b8,local_5c0))));
              if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar142 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar142 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar142 >> 0x7f,0) != '\0') ||
                    (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar142 >> 0xbf,0) != '\0') ||
                  (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar142[0x1f] < '\0') {
                auVar166 = ZEXT1632(CONCAT412(fVar221 * auVar132._12_4_,
                                              CONCAT48(fVar150 * auVar132._8_4_,
                                                       CONCAT44(fVar130 * auVar132._4_4_,
                                                                fVar152 * auVar132._0_4_))));
                auVar70._28_4_ = SUB84(uStack_5a8,4);
                auVar70._0_28_ =
                     ZEXT1628(CONCAT412(fVar221 * auVar106._12_4_,
                                        CONCAT48(fVar150 * auVar106._8_4_,
                                                 CONCAT44(fVar130 * auVar106._4_4_,
                                                          fVar152 * auVar106._0_4_))));
                auVar232._8_4_ = 0x3f800000;
                auVar232._0_8_ = &DAT_3f8000003f800000;
                auVar232._12_4_ = 0x3f800000;
                auVar232._16_4_ = 0x3f800000;
                auVar232._20_4_ = 0x3f800000;
                auVar232._24_4_ = 0x3f800000;
                auVar232._28_4_ = 0x3f800000;
                auVar139 = vsubps_avx(auVar232,auVar166);
                local_120 = vblendvps_avx(auVar139,auVar166,auVar178);
                auVar139 = vsubps_avx(auVar232,auVar70);
                local_380 = vblendvps_avx(auVar139,auVar70,auVar178);
                auVar182 = ZEXT3264(auVar142);
                local_520 = auVar202;
              }
            }
            auVar226 = ZEXT3264(auVar118);
            auVar142 = auVar182._0_32_;
            if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar142 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar142 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar142 >> 0x7f,0) == '\0') &&
                  (auVar182 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                 SUB321(auVar142 >> 0xbf,0) == '\0') &&
                (auVar182 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                -1 < auVar182[0x1f]) goto LAB_0164d86e;
            auVar139 = vsubps_avx(ZEXT1632(auVar17),auVar113);
            auVar17 = vfmadd213ps_fma(auVar139,local_120,auVar113);
            fVar152 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
            auVar71._4_4_ = (auVar17._4_4_ + auVar17._4_4_) * fVar152;
            auVar71._0_4_ = (auVar17._0_4_ + auVar17._0_4_) * fVar152;
            auVar71._8_4_ = (auVar17._8_4_ + auVar17._8_4_) * fVar152;
            auVar71._12_4_ = (auVar17._12_4_ + auVar17._12_4_) * fVar152;
            auVar71._16_4_ = fVar152 * 0.0;
            auVar71._20_4_ = fVar152 * 0.0;
            auVar71._24_4_ = fVar152 * 0.0;
            auVar71._28_4_ = fVar152;
            auVar139 = vcmpps_avx(local_520,auVar71,6);
            auVar202 = auVar142 & auVar139;
            auVar210 = ZEXT3264(local_760);
            if ((((((((auVar202 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar202 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar202 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar202 >> 0x7f,0) == '\0') &&
                  (auVar202 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar202 >> 0xbf,0) == '\0') &&
                (auVar202 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar202[0x1f]) {
              auVar148 = ZEXT3264(local_660);
            }
            else {
              local_400 = vandps_avx(auVar139,auVar142);
              auVar143._8_4_ = 0xbf800000;
              auVar143._0_8_ = 0xbf800000bf800000;
              auVar143._12_4_ = 0xbf800000;
              auVar143._16_4_ = 0xbf800000;
              auVar143._20_4_ = 0xbf800000;
              auVar143._24_4_ = 0xbf800000;
              auVar143._28_4_ = 0xbf800000;
              auVar167._8_4_ = 0x40000000;
              auVar167._0_8_ = 0x4000000040000000;
              auVar167._12_4_ = 0x40000000;
              auVar167._16_4_ = 0x40000000;
              auVar167._20_4_ = 0x40000000;
              auVar167._24_4_ = 0x40000000;
              auVar167._28_4_ = 0x40000000;
              auVar17 = vfmadd213ps_fma(local_380,auVar167,auVar143);
              auVar182 = ZEXT1664(auVar17);
              local_4c0 = local_120;
              local_4a0 = ZEXT1632(auVar17);
              local_380 = local_4a0;
              auVar142 = local_380;
              local_480 = local_520;
              local_440 = local_6e0._0_8_;
              uStack_438 = local_6e0._8_8_;
              local_430 = local_6f0._0_8_;
              uStack_428 = local_6f0._8_8_;
              local_420 = local_700;
              uStack_418 = uStack_6f8;
              pGVar100 = (context->scene->geometries).items[uVar96].ptr;
              local_380 = auVar142;
              if ((pGVar100->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                auVar237 = ZEXT1264(ZEXT812(0));
                fVar152 = (float)local_460;
                local_3e0[0] = (fVar152 + local_120._0_4_ + 0.0) * local_500;
                local_3e0[1] = (fVar152 + local_120._4_4_ + 1.0) * (float)auStack_4fc._0_4_;
                local_3e0[2] = (fVar152 + local_120._8_4_ + 2.0) * (float)auStack_4fc._4_4_;
                local_3e0[3] = (fVar152 + local_120._12_4_ + 3.0) * fStack_4f4;
                fStack_3d0 = (fVar152 + local_120._16_4_ + 4.0) * fStack_4f0;
                fStack_3cc = (fVar152 + local_120._20_4_ + 5.0) * fStack_4ec;
                fStack_3c8 = (fVar152 + local_120._24_4_ + 6.0) * fStack_4e8;
                fStack_3c4 = fVar152 + local_120._28_4_ + 7.0;
                local_380._0_8_ = auVar17._0_8_;
                local_380._8_8_ = auVar17._8_8_;
                local_3c0 = local_380._0_8_;
                uStack_3b8 = local_380._8_8_;
                uStack_3b0 = 0;
                uStack_3a8 = 0;
                local_3a0 = local_520;
                auVar144._8_4_ = 0x7f800000;
                auVar144._0_8_ = 0x7f8000007f800000;
                auVar144._12_4_ = 0x7f800000;
                auVar144._16_4_ = 0x7f800000;
                auVar144._20_4_ = 0x7f800000;
                auVar144._24_4_ = 0x7f800000;
                auVar144._28_4_ = 0x7f800000;
                auVar142 = vblendvps_avx(auVar144,local_520,local_400);
                auVar139 = vshufps_avx(auVar142,auVar142,0xb1);
                auVar139 = vminps_avx(auVar142,auVar139);
                auVar202 = vshufpd_avx(auVar139,auVar139,5);
                auVar139 = vminps_avx(auVar139,auVar202);
                auVar202 = vpermpd_avx2(auVar139,0x4e);
                auVar139 = vminps_avx(auVar139,auVar202);
                auVar139 = vcmpps_avx(auVar142,auVar139,0);
                auVar202 = local_400 & auVar139;
                auVar142 = local_400;
                if ((((((((auVar202 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar202 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar202 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar202 >> 0x7f,0) != '\0') ||
                      (auVar202 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar202 >> 0xbf,0) != '\0') ||
                    (auVar202 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar202[0x1f] < '\0') {
                  auVar142 = vandps_avx(auVar139,local_400);
                }
                uVar94 = vmovmskps_avx(auVar142);
                uVar98 = 0;
                for (; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x80000000) {
                  uVar98 = uVar98 + 1;
                }
                uVar95 = (ulong)uVar98;
                local_8a0 = ZEXT1632(CONCAT88(auVar12._8_8_,uVar95));
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar100->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar152 = local_3e0[uVar95];
                  uVar227 = *(undefined4 *)((long)&local_3c0 + uVar95 * 4);
                  fVar150 = 1.0 - fVar152;
                  fVar130 = fVar150 * fVar150 * -3.0;
                  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar150 * fVar150)),
                                            ZEXT416((uint)(fVar152 * fVar150)),ZEXT416(0xc0000000));
                  auVar15 = vfmsub132ss_fma(ZEXT416((uint)(fVar152 * fVar150)),
                                            ZEXT416((uint)(fVar152 * fVar152)),ZEXT416(0x40000000));
                  fVar150 = auVar12._0_4_ * 3.0;
                  fVar221 = auVar15._0_4_ * 3.0;
                  fVar222 = fVar152 * fVar152 * 3.0;
                  auVar195._0_4_ = fVar222 * (float)local_700._0_4_;
                  auVar195._4_4_ = fVar222 * (float)local_700._4_4_;
                  auVar195._8_4_ = fVar222 * (float)uStack_6f8;
                  auVar195._12_4_ = fVar222 * uStack_6f8._4_4_;
                  auVar156._4_4_ = fVar221;
                  auVar156._0_4_ = fVar221;
                  auVar156._8_4_ = fVar221;
                  auVar156._12_4_ = fVar221;
                  auVar12 = vfmadd132ps_fma(auVar156,auVar195,local_6f0);
                  auVar174._4_4_ = fVar150;
                  auVar174._0_4_ = fVar150;
                  auVar174._8_4_ = fVar150;
                  auVar174._12_4_ = fVar150;
                  auVar12 = vfmadd132ps_fma(auVar174,auVar12,local_6e0);
                  auVar157._4_4_ = fVar130;
                  auVar157._0_4_ = fVar130;
                  auVar157._8_4_ = fVar130;
                  auVar157._12_4_ = fVar130;
                  auVar12 = vfmadd132ps_fma(auVar157,auVar12,auVar13);
                  auVar182 = ZEXT464(*(uint *)(local_3a0 + uVar95 * 4));
                  *(uint *)(ray + k * 4 + 0x100) = *(uint *)(local_3a0 + uVar95 * 4);
                  *(int *)(ray + k * 4 + 0x180) = auVar12._0_4_;
                  uVar9 = vextractps_avx(auVar12,1);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar9;
                  uVar9 = vextractps_avx(auVar12,2);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar9;
                  *(float *)(ray + k * 4 + 0x1e0) = fVar152;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar227;
                  *(undefined4 *)(ray + k * 4 + 0x220) = uVar4;
                  *(uint *)(ray + k * 4 + 0x240) = uVar96;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                }
                else {
                  _local_620 = _local_700;
                  local_680 = ZEXT1632(CONCAT88(auVar15._8_8_,lVar99));
                  local_6a0 = ZEXT1632(CONCAT88(auVar16._8_8_,pGVar100));
                  local_600 = local_400;
                  local_45c = iVar93;
                  local_450 = uVar82;
                  uStack_448 = uVar83;
                  do {
                    auVar139 = local_8a0;
                    uVar98 = *(uint *)(ray + k * 4 + 0x100);
                    local_240 = local_3e0[local_8a0._0_8_];
                    uVar227 = *(undefined4 *)((long)&local_3c0 + local_8a0._0_8_ * 4);
                    local_220._4_4_ = uVar227;
                    local_220._0_4_ = uVar227;
                    local_220._8_4_ = uVar227;
                    local_220._12_4_ = uVar227;
                    local_220._16_4_ = uVar227;
                    local_220._20_4_ = uVar227;
                    local_220._24_4_ = uVar227;
                    local_220._28_4_ = uVar227;
                    *(undefined4 *)(ray + k * 4 + 0x100) =
                         *(undefined4 *)(local_3a0 + local_8a0._0_8_ * 4);
                    fVar150 = 1.0 - local_240;
                    auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar150 * fVar150)),
                                              ZEXT416((uint)(local_240 * fVar150)),
                                              ZEXT416(0xc0000000));
                    auVar12 = vfmsub132ss_fma(ZEXT416((uint)(local_240 * fVar150)),
                                              ZEXT416((uint)(local_240 * local_240)),
                                              ZEXT416(0x40000000));
                    fVar152 = auVar12._0_4_ * 3.0;
                    fVar130 = local_240 * local_240 * 3.0;
                    auVar196._0_4_ = fVar130 * (float)local_620._0_4_;
                    auVar196._4_4_ = fVar130 * (float)local_620._4_4_;
                    auVar196._8_4_ = fVar130 * fStack_618;
                    auVar196._12_4_ = fVar130 * fStack_614;
                    auVar158._4_4_ = fVar152;
                    auVar158._0_4_ = fVar152;
                    auVar158._8_4_ = fVar152;
                    auVar158._12_4_ = fVar152;
                    auVar12 = vfmadd132ps_fma(auVar158,auVar196,auVar107);
                    fVar152 = auVar15._0_4_ * 3.0;
                    auVar187._4_4_ = fVar152;
                    auVar187._0_4_ = fVar152;
                    auVar187._8_4_ = fVar152;
                    auVar187._12_4_ = fVar152;
                    auVar12 = vfmadd132ps_fma(auVar187,auVar12,auVar153);
                    fVar152 = fVar150 * fVar150 * -3.0;
                    local_7b0.context = context->user;
                    auVar159._4_4_ = fVar152;
                    auVar159._0_4_ = fVar152;
                    auVar159._8_4_ = fVar152;
                    auVar159._12_4_ = fVar152;
                    auVar15 = vfmadd132ps_fma(auVar159,auVar12,auVar14);
                    local_2a0 = auVar15._0_4_;
                    uStack_29c = local_2a0;
                    uStack_298 = local_2a0;
                    uStack_294 = local_2a0;
                    uStack_290 = local_2a0;
                    uStack_28c = local_2a0;
                    uStack_288 = local_2a0;
                    uStack_284 = local_2a0;
                    auVar12 = vmovshdup_avx(auVar15);
                    auVar175._0_8_ = auVar12._0_8_;
                    auVar175._8_8_ = auVar175._0_8_;
                    auVar181._16_8_ = auVar175._0_8_;
                    auVar181._0_16_ = auVar175;
                    auVar181._24_8_ = auVar175._0_8_;
                    local_280 = auVar181;
                    auVar12 = vshufps_avx(auVar15,auVar15,0xaa);
                    auVar160._0_8_ = auVar12._0_8_;
                    auVar160._8_8_ = auVar160._0_8_;
                    auVar168._16_8_ = auVar160._0_8_;
                    auVar168._0_16_ = auVar160;
                    auVar168._24_8_ = auVar160._0_8_;
                    local_260 = auVar168;
                    fStack_23c = local_240;
                    fStack_238 = local_240;
                    fStack_234 = local_240;
                    fStack_230 = local_240;
                    fStack_22c = local_240;
                    fStack_228 = local_240;
                    fStack_224 = local_240;
                    local_200 = CONCAT44(uStack_17c,local_180);
                    uStack_1f8 = CONCAT44(uStack_174,uStack_178);
                    uStack_1f0 = CONCAT44(uStack_16c,uStack_170);
                    uStack_1e8 = CONCAT44(uStack_164,uStack_168);
                    local_1e0 = CONCAT44(uStack_15c,local_160);
                    uStack_1d8 = CONCAT44(uStack_154,uStack_158);
                    uStack_1d0 = CONCAT44(uStack_14c,uStack_150);
                    uStack_1c8 = CONCAT44(uStack_144,uStack_148);
                    auVar142 = vpcmpeqd_avx2(local_220,local_220);
                    local_6c8[1] = auVar142;
                    *local_6c8 = auVar142;
                    local_1c0 = (local_7b0.context)->instID[0];
                    uStack_1bc = local_1c0;
                    uStack_1b8 = local_1c0;
                    uStack_1b4 = local_1c0;
                    uStack_1b0 = local_1c0;
                    uStack_1ac = local_1c0;
                    uStack_1a8 = local_1c0;
                    uStack_1a4 = local_1c0;
                    local_1a0 = (local_7b0.context)->instPrimID[0];
                    uStack_19c = local_1a0;
                    uStack_198 = local_1a0;
                    uStack_194 = local_1a0;
                    uStack_190 = local_1a0;
                    uStack_18c = local_1a0;
                    uStack_188 = local_1a0;
                    uStack_184 = local_1a0;
                    local_5e0 = local_2c0._0_8_;
                    uStack_5d8 = local_2c0._8_8_;
                    uStack_5d0 = local_2c0._16_8_;
                    uStack_5c8 = local_2c0._24_8_;
                    local_7b0.valid = (int *)&local_5e0;
                    local_7b0.geometryUserPtr = pGVar100->userPtr;
                    local_7b0.hit = (RTCHitN *)&local_2a0;
                    local_7b0.N = 8;
                    local_7b0.ray = (RTCRayN *)ray;
                    if (pGVar100->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar168 = ZEXT1632(auVar160);
                      auVar181 = ZEXT1632(auVar175);
                      (*pGVar100->intersectionFilterN)(&local_7b0);
                      auVar226._8_56_ = extraout_var;
                      auVar226._0_8_ = extraout_XMM1_Qa;
                      auVar210 = ZEXT3264(local_760);
                      auVar142 = vpcmpeqd_avx2(auVar226._0_32_,auVar226._0_32_);
                      lVar99 = local_680._0_8_;
                      pGVar100 = (Geometry *)local_6a0._0_8_;
                      fVar103 = local_720;
                      fVar122 = fStack_71c;
                      fVar124 = fStack_718;
                      fVar126 = fStack_714;
                      fVar127 = fStack_710;
                      fVar128 = fStack_70c;
                      fVar129 = fStack_708;
                      fVar170 = fStack_704;
                      fVar171 = (float)local_780;
                      fVar183 = local_780._4_4_;
                      fVar151 = (float)uStack_778;
                      fVar123 = uStack_778._4_4_;
                      fVar125 = (float)uStack_770;
                      fVar243 = uStack_770._4_4_;
                      fVar244 = (float)uStack_768;
                    }
                    auVar84._8_8_ = uStack_5d8;
                    auVar84._0_8_ = local_5e0;
                    auVar84._16_8_ = uStack_5d0;
                    auVar84._24_8_ = uStack_5c8;
                    auVar166 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar84);
                    auVar202 = auVar142 & ~auVar166;
                    if ((((((((auVar202 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar202 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar202 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar202 >> 0x7f,0) == '\0') &&
                          (auVar202 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar202 >> 0xbf,0) == '\0') &&
                        (auVar202 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar202[0x1f]) {
                      auVar166 = auVar166 ^ auVar142;
                      auVar182 = ZEXT3264(local_520);
                    }
                    else {
                      p_Var10 = context->args->filter;
                      if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar100->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar168 = ZEXT1632(auVar168._0_16_);
                        auVar181 = ZEXT1632(auVar181._0_16_);
                        (*p_Var10)(&local_7b0);
                        auVar210 = ZEXT3264(local_760);
                        lVar99 = local_680._0_8_;
                        pGVar100 = (Geometry *)local_6a0._0_8_;
                        fVar103 = local_720;
                        fVar122 = fStack_71c;
                        fVar124 = fStack_718;
                        fVar126 = fStack_714;
                        fVar127 = fStack_710;
                        fVar128 = fStack_70c;
                        fVar129 = fStack_708;
                        fVar170 = fStack_704;
                        fVar171 = (float)local_780;
                        fVar183 = local_780._4_4_;
                        fVar151 = (float)uStack_778;
                        fVar123 = uStack_778._4_4_;
                        fVar125 = (float)uStack_770;
                        fVar243 = uStack_770._4_4_;
                        fVar244 = (float)uStack_768;
                      }
                      auVar85._8_8_ = uStack_5d8;
                      auVar85._0_8_ = local_5e0;
                      auVar85._16_8_ = uStack_5d0;
                      auVar85._24_8_ = uStack_5c8;
                      auVar202 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar85);
                      auVar142 = vpcmpeqd_avx2(auVar181,auVar181);
                      auVar166 = auVar202 ^ auVar142;
                      auVar234 = vpcmpeqd_avx2(auVar168,auVar168);
                      auVar142 = auVar142 & ~auVar202;
                      auVar182 = ZEXT3264(local_520);
                      if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar142 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar142 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar142 >> 0x7f,0) != '\0') ||
                            (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar142 >> 0xbf,0) != '\0') ||
                          (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar142[0x1f] < '\0') {
                        auVar202 = auVar202 ^ auVar234;
                        auVar142 = vmaskmovps_avx(auVar202,*(undefined1 (*) [32])local_7b0.hit);
                        *(undefined1 (*) [32])(local_7b0.ray + 0x180) = auVar142;
                        auVar142 = vmaskmovps_avx(auVar202,*(undefined1 (*) [32])
                                                            (local_7b0.hit + 0x20));
                        *(undefined1 (*) [32])(local_7b0.ray + 0x1a0) = auVar142;
                        auVar142 = vmaskmovps_avx(auVar202,*(undefined1 (*) [32])
                                                            (local_7b0.hit + 0x40));
                        *(undefined1 (*) [32])(local_7b0.ray + 0x1c0) = auVar142;
                        auVar142 = vmaskmovps_avx(auVar202,*(undefined1 (*) [32])
                                                            (local_7b0.hit + 0x60));
                        *(undefined1 (*) [32])(local_7b0.ray + 0x1e0) = auVar142;
                        auVar142 = vmaskmovps_avx(auVar202,*(undefined1 (*) [32])
                                                            (local_7b0.hit + 0x80));
                        *(undefined1 (*) [32])(local_7b0.ray + 0x200) = auVar142;
                        auVar142 = vpmaskmovd_avx2(auVar202,*(undefined1 (*) [32])
                                                             (local_7b0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_7b0.ray + 0x220) = auVar142;
                        auVar142 = vpmaskmovd_avx2(auVar202,*(undefined1 (*) [32])
                                                             (local_7b0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_7b0.ray + 0x240) = auVar142;
                        auVar142 = vpmaskmovd_avx2(auVar202,*(undefined1 (*) [32])
                                                             (local_7b0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_7b0.ray + 0x260) = auVar142;
                        auVar142 = vpmaskmovd_avx2(auVar202,*(undefined1 (*) [32])
                                                             (local_7b0.hit + 0x100));
                        *(undefined1 (*) [32])(local_7b0.ray + 0x280) = auVar142;
                      }
                    }
                    auVar237 = ZEXT464(uVar98);
                    if ((((((((auVar166 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar166 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar166 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar166 >> 0x7f,0) == '\0') &&
                          (auVar166 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar166 >> 0xbf,0) == '\0') &&
                        (auVar166 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar166[0x1f]) {
                      *(uint *)(ray + k * 4 + 0x100) = uVar98;
                    }
                    *(undefined4 *)(local_600 + local_8a0._0_8_ * 4) = 0;
                    uVar227 = *(undefined4 *)(ray + k * 4 + 0x100);
                    auVar120._4_4_ = uVar227;
                    auVar120._0_4_ = uVar227;
                    auVar120._8_4_ = uVar227;
                    auVar120._12_4_ = uVar227;
                    auVar120._16_4_ = uVar227;
                    auVar120._20_4_ = uVar227;
                    auVar120._24_4_ = uVar227;
                    auVar120._28_4_ = uVar227;
                    auVar202 = vcmpps_avx(auVar182._0_32_,auVar120,2);
                    auVar142 = vandps_avx(auVar202,local_600);
                    local_600 = local_600 & auVar202;
                    bVar79 = (local_600 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar80 = (local_600 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar78 = (local_600 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar77 = SUB321(local_600 >> 0x7f,0) != '\0';
                    bVar76 = (local_600 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar75 = SUB321(local_600 >> 0xbf,0) != '\0';
                    bVar73 = (local_600 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar72 = local_600[0x1f] < '\0';
                    if (((((((bVar79 || bVar80) || bVar78) || bVar77) || bVar76) || bVar75) ||
                        bVar73) || bVar72) {
                      auVar145._8_4_ = 0x7f800000;
                      auVar145._0_8_ = 0x7f8000007f800000;
                      auVar145._12_4_ = 0x7f800000;
                      auVar145._16_4_ = 0x7f800000;
                      auVar145._20_4_ = 0x7f800000;
                      auVar145._24_4_ = 0x7f800000;
                      auVar145._28_4_ = 0x7f800000;
                      auVar202 = vblendvps_avx(auVar145,auVar182._0_32_,auVar142);
                      auVar166 = vshufps_avx(auVar202,auVar202,0xb1);
                      auVar166 = vminps_avx(auVar202,auVar166);
                      auVar234 = vshufpd_avx(auVar166,auVar166,5);
                      auVar166 = vminps_avx(auVar166,auVar234);
                      auVar234 = vpermpd_avx2(auVar166,0x4e);
                      auVar182 = ZEXT3264(auVar234);
                      auVar166 = vminps_avx(auVar166,auVar234);
                      auVar166 = vcmpps_avx(auVar202,auVar166,0);
                      auVar234 = auVar142 & auVar166;
                      auVar202 = auVar142;
                      if ((((((((auVar234 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar234 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar234 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar234 >> 0x7f,0) != '\0') ||
                            (auVar234 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar234 >> 0xbf,0) != '\0') ||
                          (auVar234 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar234[0x1f] < '\0') {
                        auVar202 = vandps_avx(auVar166,auVar142);
                      }
                      uVar98 = vmovmskps_avx(auVar202);
                      local_8a0._0_4_ = 0;
                      for (; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x80000000) {
                        local_8a0._0_4_ = local_8a0._0_4_ + 1;
                      }
                      local_8a0._4_4_ = 0;
                      local_8a0._8_24_ = auVar139._8_24_;
                    }
                    local_600 = auVar142;
                  } while (((((((bVar79 || bVar80) || bVar78) || bVar77) || bVar76) || bVar75) ||
                           bVar73) || bVar72);
                }
              }
              auVar226 = ZEXT3264(auVar118);
              auVar148 = ZEXT3264(local_660);
            }
          }
          auVar220 = ZEXT3264(auVar110);
          lVar99 = lVar99 + 8;
        } while ((int)lVar99 < iVar93);
      }
      uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar109._4_4_ = uVar4;
      auVar109._0_4_ = uVar4;
      auVar109._8_4_ = uVar4;
      auVar109._12_4_ = uVar4;
      auVar12 = vcmpps_avx(local_2e0,auVar109,2);
      uVar96 = vmovmskps_avx(auVar12);
      uVar96 = (uint)uVar101 & uVar96;
    } while (uVar96 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }